

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  byte bVar48;
  byte bVar49;
  byte bVar50;
  ulong uVar51;
  byte bVar52;
  long lVar53;
  uint uVar54;
  byte bVar55;
  ulong uVar56;
  bool bVar57;
  byte bVar58;
  uint uVar59;
  bool bVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar136;
  uint uVar137;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar160;
  float fVar161;
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar162;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar165 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  vint4 bi;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar222;
  float fVar223;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar224;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar213 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [32];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  float fVar228;
  vint4 ai_2;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  vint4 ai;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  float fVar248;
  vint4 ai_1;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  float fVar257;
  float fVar263;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar261;
  float fVar262;
  undefined1 auVar260 [64];
  undefined1 auVar264 [64];
  undefined1 auVar266 [16];
  undefined1 auVar265 [64];
  undefined1 auVar267 [64];
  float s;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_adc;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar129 [32];
  undefined1 auVar133 [32];
  
  PVar1 = prim[1];
  uVar56 = (ulong)(byte)PVar1;
  fVar228 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar67 = vsubps_avx(auVar67,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  auVar206._0_4_ = fVar228 * auVar67._0_4_;
  auVar206._4_4_ = fVar228 * auVar67._4_4_;
  auVar206._8_4_ = fVar228 * auVar67._8_4_;
  auVar206._12_4_ = fVar228 * auVar67._12_4_;
  auVar143._0_4_ = fVar228 * auVar65._0_4_;
  auVar143._4_4_ = fVar228 * auVar65._4_4_;
  auVar143._8_4_ = fVar228 * auVar65._8_4_;
  auVar143._12_4_ = fVar228 * auVar65._12_4_;
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xb + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar56 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar61 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar266 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar266 = vcvtdq2ps_avx(auVar266);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + uVar56 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar51 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar272._4_4_ = auVar143._0_4_;
  auVar272._0_4_ = auVar143._0_4_;
  auVar272._8_4_ = auVar143._0_4_;
  auVar272._12_4_ = auVar143._0_4_;
  auVar73 = vshufps_avx(auVar143,auVar143,0x55);
  auVar66 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar228 = auVar66._0_4_;
  auVar181._0_4_ = fVar228 * auVar68._0_4_;
  fVar160 = auVar66._4_4_;
  auVar181._4_4_ = fVar160 * auVar68._4_4_;
  fVar161 = auVar66._8_4_;
  auVar181._8_4_ = fVar161 * auVar68._8_4_;
  fVar205 = auVar66._12_4_;
  auVar181._12_4_ = fVar205 * auVar68._12_4_;
  auVar163._0_4_ = auVar69._0_4_ * fVar228;
  auVar163._4_4_ = auVar69._4_4_ * fVar160;
  auVar163._8_4_ = auVar69._8_4_ * fVar161;
  auVar163._12_4_ = auVar69._12_4_ * fVar205;
  auVar75._0_4_ = auVar72._0_4_ * fVar228;
  auVar75._4_4_ = auVar72._4_4_ * fVar160;
  auVar75._8_4_ = auVar72._8_4_ * fVar161;
  auVar75._12_4_ = auVar72._12_4_ * fVar205;
  auVar66 = vfmadd231ps_fma(auVar181,auVar73,auVar65);
  auVar74 = vfmadd231ps_fma(auVar163,auVar73,auVar76);
  auVar73 = vfmadd231ps_fma(auVar75,auVar71,auVar73);
  auVar64 = vfmadd231ps_fma(auVar66,auVar272,auVar67);
  auVar74 = vfmadd231ps_fma(auVar74,auVar272,auVar70);
  auVar143 = vfmadd231ps_fma(auVar73,auVar266,auVar272);
  auVar273._4_4_ = auVar206._0_4_;
  auVar273._0_4_ = auVar206._0_4_;
  auVar273._8_4_ = auVar206._0_4_;
  auVar273._12_4_ = auVar206._0_4_;
  auVar73 = vshufps_avx(auVar206,auVar206,0x55);
  auVar66 = vshufps_avx(auVar206,auVar206,0xaa);
  fVar228 = auVar66._0_4_;
  auVar276._0_4_ = fVar228 * auVar68._0_4_;
  fVar160 = auVar66._4_4_;
  auVar276._4_4_ = fVar160 * auVar68._4_4_;
  fVar161 = auVar66._8_4_;
  auVar276._8_4_ = fVar161 * auVar68._8_4_;
  fVar205 = auVar66._12_4_;
  auVar276._12_4_ = fVar205 * auVar68._12_4_;
  auVar229._0_4_ = auVar69._0_4_ * fVar228;
  auVar229._4_4_ = auVar69._4_4_ * fVar160;
  auVar229._8_4_ = auVar69._8_4_ * fVar161;
  auVar229._12_4_ = auVar69._12_4_ * fVar205;
  auVar207._0_4_ = auVar72._0_4_ * fVar228;
  auVar207._4_4_ = auVar72._4_4_ * fVar160;
  auVar207._8_4_ = auVar72._8_4_ * fVar161;
  auVar207._12_4_ = auVar72._12_4_ * fVar205;
  auVar65 = vfmadd231ps_fma(auVar276,auVar73,auVar65);
  auVar68 = vfmadd231ps_fma(auVar229,auVar73,auVar76);
  auVar76 = vfmadd231ps_fma(auVar207,auVar73,auVar71);
  auVar69 = vfmadd231ps_fma(auVar65,auVar273,auVar67);
  auVar71 = vfmadd231ps_fma(auVar68,auVar273,auVar70);
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar72 = vfmadd231ps_fma(auVar76,auVar273,auVar266);
  auVar67 = vandps_avx(auVar64,auVar252);
  auVar241._8_4_ = 0x219392ef;
  auVar241._0_8_ = 0x219392ef219392ef;
  auVar241._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar67,auVar241,1);
  bVar57 = (bool)((byte)uVar61 & 1);
  auVar66._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._0_4_;
  bVar57 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._4_4_;
  bVar57 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._8_4_;
  bVar57 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._12_4_;
  auVar67 = vandps_avx(auVar74,auVar252);
  uVar61 = vcmpps_avx512vl(auVar67,auVar241,1);
  bVar57 = (bool)((byte)uVar61 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._0_4_;
  bVar57 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._4_4_;
  bVar57 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._8_4_;
  bVar57 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._12_4_;
  auVar67 = vandps_avx(auVar143,auVar252);
  uVar61 = vcmpps_avx512vl(auVar67,auVar241,1);
  bVar57 = (bool)((byte)uVar61 & 1);
  auVar74._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar143._0_4_;
  bVar57 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar143._4_4_;
  bVar57 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar143._8_4_;
  bVar57 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar143._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar66);
  auVar242._8_4_ = 0x3f800000;
  auVar242._0_8_ = 0x3f8000003f800000;
  auVar242._12_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar66,auVar65,auVar242);
  auVar70 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar67 = vfnmadd213ps_fma(auVar64,auVar65,auVar242);
  auVar76 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar74);
  auVar67 = vfnmadd213ps_fma(auVar74,auVar65,auVar242);
  auVar266 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar67 = vpmovsxwd_avx(auVar67);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar69);
  auVar236._0_4_ = auVar70._0_4_ * auVar67._0_4_;
  auVar236._4_4_ = auVar70._4_4_ * auVar67._4_4_;
  auVar236._8_4_ = auVar70._8_4_ * auVar67._8_4_;
  auVar236._12_4_ = auVar70._12_4_ * auVar67._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar67 = vpmovsxwd_avx(auVar65);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar69);
  auVar66 = vpbroadcastd_avx512vl();
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar65 = vpmovsxwd_avx(auVar68);
  auVar182._0_4_ = auVar70._0_4_ * auVar67._0_4_;
  auVar182._4_4_ = auVar70._4_4_ * auVar67._4_4_;
  auVar182._8_4_ = auVar70._8_4_ * auVar67._8_4_;
  auVar182._12_4_ = auVar70._12_4_ * auVar67._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar56 * -2 + 6);
  auVar67 = vpmovsxwd_avx(auVar70);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar71);
  auVar243._0_4_ = auVar76._0_4_ * auVar67._0_4_;
  auVar243._4_4_ = auVar76._4_4_ * auVar67._4_4_;
  auVar243._8_4_ = auVar76._8_4_ * auVar67._8_4_;
  auVar243._12_4_ = auVar76._12_4_ * auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar65);
  auVar67 = vsubps_avx(auVar67,auVar71);
  auVar164._0_4_ = auVar76._0_4_ * auVar67._0_4_;
  auVar164._4_4_ = auVar76._4_4_ * auVar67._4_4_;
  auVar164._8_4_ = auVar76._8_4_ * auVar67._8_4_;
  auVar164._12_4_ = auVar76._12_4_ * auVar67._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar51 + uVar56 + 6);
  auVar67 = vpmovsxwd_avx(auVar76);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar72);
  auVar230._0_4_ = auVar266._0_4_ * auVar67._0_4_;
  auVar230._4_4_ = auVar266._4_4_ * auVar67._4_4_;
  auVar230._8_4_ = auVar266._8_4_ * auVar67._8_4_;
  auVar230._12_4_ = auVar266._12_4_ * auVar67._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar56 * 0x17 + 6);
  auVar67 = vpmovsxwd_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar72);
  auVar144._0_4_ = auVar266._0_4_ * auVar67._0_4_;
  auVar144._4_4_ = auVar266._4_4_ * auVar67._4_4_;
  auVar144._8_4_ = auVar266._8_4_ * auVar67._8_4_;
  auVar144._12_4_ = auVar266._12_4_ * auVar67._12_4_;
  auVar67 = vpminsd_avx(auVar236,auVar182);
  auVar65 = vpminsd_avx(auVar243,auVar164);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar65 = vpminsd_avx(auVar230,auVar144);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar266._4_4_ = uVar162;
  auVar266._0_4_ = uVar162;
  auVar266._8_4_ = uVar162;
  auVar266._12_4_ = uVar162;
  auVar65 = vmaxps_avx512vl(auVar65,auVar266);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar67,auVar71);
  auVar67 = vpmaxsd_avx(auVar236,auVar182);
  auVar65 = vpmaxsd_avx(auVar243,auVar164);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar65 = vpmaxsd_avx(auVar230,auVar144);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar72._4_4_ = uVar162;
  auVar72._0_4_ = uVar162;
  auVar72._8_4_ = uVar162;
  auVar72._12_4_ = uVar162;
  auVar65 = vminps_avx512vl(auVar65,auVar72);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar73._8_4_ = 0x3f800003;
  auVar73._0_8_ = 0x3f8000033f800003;
  auVar73._12_4_ = 0x3f800003;
  auVar67 = vmulps_avx512vl(auVar67,auVar73);
  uVar12 = vcmpps_avx512vl(local_560,auVar67,2);
  local_688 = vpcmpgtd_avx512vl(auVar66,_DAT_01f7fcf0);
  local_688 = ((byte)uVar12 & 0xf) & local_688;
  if ((char)local_688 == '\0') {
    return false;
  }
  local_540 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_690 = prim;
LAB_01ac43d4:
  lVar53 = 0;
  for (uVar61 = local_688; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar59 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar59].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar53 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar53 = *(long *)&pGVar2[1].time_range.upper;
  auVar67 = *(undefined1 (*) [16])(lVar53 + (long)p_Var3 * uVar61);
  auVar65 = *(undefined1 (*) [16])(lVar53 + (uVar61 + 1) * (long)p_Var3);
  local_688 = local_688 - 1 & local_688;
  if (local_688 != 0) {
    uVar56 = local_688 - 1 & local_688;
    for (uVar51 = local_688; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar70 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar268._4_4_ = uVar162;
  auVar268._0_4_ = uVar162;
  auVar268._8_4_ = uVar162;
  auVar268._12_4_ = uVar162;
  fStack_5b0 = (float)uVar162;
  _local_5c0 = auVar268;
  fStack_5ac = (float)uVar162;
  fStack_5a8 = (float)uVar162;
  register0x0000151c = uVar162;
  uVar162 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar274._4_4_ = uVar162;
  auVar274._0_4_ = uVar162;
  auVar274._8_4_ = uVar162;
  auVar274._12_4_ = uVar162;
  local_5e0._16_4_ = uVar162;
  local_5e0._0_16_ = auVar274;
  local_5e0._20_4_ = uVar162;
  local_5e0._24_4_ = uVar162;
  local_5e0._28_4_ = uVar162;
  auVar68 = vunpcklps_avx(auVar268,auVar274);
  fVar228 = *(float *)(ray + k * 4 + 0xc0);
  auVar275._4_4_ = fVar228;
  auVar275._0_4_ = fVar228;
  auVar275._8_4_ = fVar228;
  auVar275._12_4_ = fVar228;
  local_600._16_4_ = fVar228;
  local_600._0_16_ = auVar275;
  local_600._20_4_ = fVar228;
  local_600._24_4_ = fVar228;
  local_600._28_4_ = fVar228;
  local_7b0 = vinsertps_avx(auVar68,auVar275,0x28);
  auVar237._0_4_ = auVar67._0_4_ + auVar65._0_4_;
  auVar237._4_4_ = auVar67._4_4_ + auVar65._4_4_;
  auVar237._8_4_ = auVar67._8_4_ + auVar65._8_4_;
  auVar237._12_4_ = auVar67._12_4_ + auVar65._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar68 = vmulps_avx512vl(auVar237,auVar16);
  auVar68 = vsubps_avx(auVar68,auVar70);
  auVar68 = vdpps_avx(auVar68,local_7b0,0x7f);
  fVar160 = *(float *)(ray + k * 4 + 0x60);
  auVar264 = ZEXT464((uint)fVar160);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar267 = ZEXT1664(local_7c0);
  auVar244._4_12_ = ZEXT812(0) << 0x20;
  auVar244._0_4_ = local_7c0._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar244);
  auVar76 = vfnmadd213ss_fma(auVar69,local_7c0,ZEXT416(0x40000000));
  fVar161 = auVar68._0_4_ * auVar69._0_4_ * auVar76._0_4_;
  auVar245._4_4_ = fVar161;
  auVar245._0_4_ = fVar161;
  auVar245._8_4_ = fVar161;
  auVar245._12_4_ = fVar161;
  auVar68 = vfmadd231ps_fma(auVar70,local_7b0,auVar245);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar67 = vsubps_avx(auVar67,auVar68);
  auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar53 + (uVar61 + 2) * (long)p_Var3),auVar68);
  auVar256 = ZEXT1664(auVar70);
  auVar65 = vsubps_avx(auVar65,auVar68);
  auVar260 = ZEXT1664(auVar65);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar53 + (uVar61 + 3) * (long)p_Var3),auVar68);
  auVar77 = vbroadcastss_avx512vl(auVar67);
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  local_740 = ZEXT1632(auVar67);
  auVar78 = vpermps_avx512vl(auVar88,local_740);
  auVar89._8_4_ = 2;
  auVar89._0_8_ = 0x200000002;
  auVar89._12_4_ = 2;
  auVar89._16_4_ = 2;
  auVar89._20_4_ = 2;
  auVar89._24_4_ = 2;
  auVar89._28_4_ = 2;
  auVar79 = vpermps_avx512vl(auVar89,local_740);
  auVar90._8_4_ = 3;
  auVar90._0_8_ = 0x300000003;
  auVar90._12_4_ = 3;
  auVar90._16_4_ = 3;
  auVar90._20_4_ = 3;
  auVar90._24_4_ = 3;
  auVar90._28_4_ = 3;
  auVar80 = vpermps_avx512vl(auVar90,local_740);
  auVar81 = vbroadcastss_avx512vl(auVar65);
  local_780 = ZEXT1632(auVar65);
  auVar82 = vpermps_avx512vl(auVar88,local_780);
  auVar83 = vpermps_avx512vl(auVar89,local_780);
  auVar84 = vpermps_avx512vl(auVar90,local_780);
  auVar85 = vbroadcastss_avx512vl(auVar70);
  local_760 = ZEXT1632(auVar70);
  auVar86 = vpermps_avx512vl(auVar88,local_760);
  local_280 = vpermps_avx512vl(auVar89,local_760);
  local_2a0 = vpermps_avx512vl(auVar90,local_760);
  local_260 = vbroadcastss_avx512vl(auVar68);
  _local_7a0 = ZEXT1632(auVar68);
  local_2e0 = vpermps_avx2(auVar88,_local_7a0);
  local_220 = vpermps_avx2(auVar89,_local_7a0);
  local_300 = vpermps_avx2(auVar90,_local_7a0);
  auVar67 = vfmadd231ps_fma(ZEXT432((uint)(fVar228 * fVar228)),local_5e0,local_5e0);
  auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),_local_5c0,_local_5c0);
  local_240._0_4_ = auVar67._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar87);
  local_6d0 = ZEXT416((uint)fVar161);
  local_320 = fVar160 - fVar161;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_4e0 = vpbroadcastd_avx512vl();
  local_adc = 1;
  uVar54 = 0;
  bVar57 = false;
  local_500 = vpbroadcastd_avx512vl();
  auVar67 = vsqrtss_avx(local_7c0,local_7c0);
  auVar65 = vsqrtss_avx(local_7c0,local_7c0);
  local_550 = ZEXT816(0x3f80000000000000);
  local_2c0 = local_260;
  do {
    auVar68 = vmovshdup_avx(local_550);
    auVar68 = vsubps_avx(auVar68,local_550);
    auVar153._0_4_ = auVar68._0_4_;
    fVar228 = auVar153._0_4_ * 0.04761905;
    uVar162 = local_550._0_4_;
    auVar233._4_4_ = uVar162;
    auVar233._0_4_ = uVar162;
    auVar233._8_4_ = uVar162;
    auVar233._12_4_ = uVar162;
    auVar233._16_4_ = uVar162;
    auVar233._20_4_ = uVar162;
    auVar233._24_4_ = uVar162;
    auVar233._28_4_ = uVar162;
    auVar153._4_4_ = auVar153._0_4_;
    auVar153._8_4_ = auVar153._0_4_;
    auVar153._12_4_ = auVar153._0_4_;
    auVar153._16_4_ = auVar153._0_4_;
    auVar153._20_4_ = auVar153._0_4_;
    auVar153._24_4_ = auVar153._0_4_;
    auVar153._28_4_ = auVar153._0_4_;
    auVar68 = vfmadd231ps_fma(auVar233,auVar153,_DAT_01faff20);
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar87 = vsubps_avx512vl(auVar87,ZEXT1632(auVar68));
    fVar205 = auVar68._0_4_;
    fVar222 = auVar68._4_4_;
    fVar223 = auVar68._8_4_;
    fVar224 = auVar68._12_4_;
    fVar226 = auVar87._0_4_;
    fVar227 = auVar87._4_4_;
    fVar248 = auVar87._8_4_;
    fVar249 = auVar87._12_4_;
    fVar250 = auVar87._16_4_;
    fVar180 = auVar87._20_4_;
    fVar251 = auVar87._24_4_;
    auVar92._4_4_ = fVar227 * fVar227 * -fVar222;
    auVar92._0_4_ = fVar226 * fVar226 * -fVar205;
    auVar92._8_4_ = fVar248 * fVar248 * -fVar223;
    auVar92._12_4_ = fVar249 * fVar249 * -fVar224;
    auVar92._16_4_ = fVar250 * fVar250 * -0.0;
    auVar92._20_4_ = fVar180 * fVar180 * -0.0;
    auVar92._24_4_ = fVar251 * fVar251 * -0.0;
    auVar92._28_4_ = 0x80000000;
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * fVar224,
                            CONCAT48(fVar223 * fVar223,CONCAT44(fVar222 * fVar222,fVar205 * fVar205)
                                    )));
    fVar257 = fVar205 * 3.0;
    fVar261 = fVar222 * 3.0;
    fVar262 = fVar223 * 3.0;
    fVar263 = fVar224 * 3.0;
    auVar247._28_36_ = auVar260._28_36_;
    auVar247._0_28_ = ZEXT1628(CONCAT412(fVar263,CONCAT48(fVar262,CONCAT44(fVar261,fVar257))));
    auVar109._0_4_ = (fVar257 + -5.0) * fVar205 * fVar205;
    auVar109._4_4_ = (fVar261 + -5.0) * fVar222 * fVar222;
    auVar109._8_4_ = (fVar262 + -5.0) * fVar223 * fVar223;
    auVar109._12_4_ = (fVar263 + -5.0) * fVar224 * fVar224;
    auVar109._16_4_ = 0x80000000;
    auVar109._20_4_ = 0x80000000;
    auVar109._24_4_ = 0x80000000;
    auVar109._28_4_ = 0;
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar89 = vaddps_avx512vl(auVar109,auVar88);
    auVar265._0_4_ = fVar226 * fVar226;
    auVar265._4_4_ = fVar227 * fVar227;
    auVar265._8_4_ = fVar248 * fVar248;
    auVar265._12_4_ = fVar249 * fVar249;
    auVar265._16_4_ = fVar250 * fVar250;
    auVar265._20_4_ = fVar180 * fVar180;
    auVar265._28_36_ = auVar264._28_36_;
    auVar265._24_4_ = fVar251 * fVar251;
    auVar95._4_4_ = auVar265._4_4_ * (fVar227 * 3.0 + -5.0);
    auVar95._0_4_ = auVar265._0_4_ * (fVar226 * 3.0 + -5.0);
    auVar95._8_4_ = auVar265._8_4_ * (fVar248 * 3.0 + -5.0);
    auVar95._12_4_ = auVar265._12_4_ * (fVar249 * 3.0 + -5.0);
    auVar95._16_4_ = auVar265._16_4_ * (fVar250 * 3.0 + -5.0);
    auVar95._20_4_ = auVar265._20_4_ * (fVar180 * 3.0 + -5.0);
    auVar95._24_4_ = auVar265._24_4_ * (fVar251 * 3.0 + -5.0);
    auVar95._28_4_ = auVar267._28_4_ + -5.0;
    auVar90 = vaddps_avx512vl(auVar95,auVar88);
    fVar225 = auVar87._28_4_;
    auVar96._4_4_ = fVar222 * fVar222 * -fVar227;
    auVar96._0_4_ = fVar205 * fVar205 * -fVar226;
    auVar96._8_4_ = fVar223 * fVar223 * -fVar248;
    auVar96._12_4_ = fVar224 * fVar224 * -fVar249;
    auVar96._16_4_ = -fVar250 * 0.0 * 0.0;
    auVar96._20_4_ = -fVar180 * 0.0 * 0.0;
    auVar96._24_4_ = -fVar251 * 0.0 * 0.0;
    auVar96._28_4_ = -fVar225;
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar87 = vmulps_avx512vl(auVar92,auVar91);
    auVar92 = vmulps_avx512vl(auVar89,auVar91);
    auVar90 = vmulps_avx512vl(auVar90,auVar91);
    auVar93 = vmulps_avx512vl(auVar96,auVar91);
    auVar94 = vmulps_avx512vl(local_2c0,auVar93);
    auVar97._4_4_ = local_2e0._4_4_ * auVar93._4_4_;
    auVar97._0_4_ = local_2e0._0_4_ * auVar93._0_4_;
    auVar97._8_4_ = local_2e0._8_4_ * auVar93._8_4_;
    auVar97._12_4_ = local_2e0._12_4_ * auVar93._12_4_;
    auVar97._16_4_ = local_2e0._16_4_ * auVar93._16_4_;
    auVar97._20_4_ = local_2e0._20_4_ * auVar93._20_4_;
    auVar97._24_4_ = local_2e0._24_4_ * auVar93._24_4_;
    auVar97._28_4_ = auVar89._28_4_;
    auVar89 = vmulps_avx512vl(local_220,auVar93);
    auVar98._4_4_ = local_300._4_4_ * auVar93._4_4_;
    auVar98._0_4_ = local_300._0_4_ * auVar93._0_4_;
    auVar98._8_4_ = local_300._8_4_ * auVar93._8_4_;
    auVar98._12_4_ = local_300._12_4_ * auVar93._12_4_;
    auVar98._16_4_ = local_300._16_4_ * auVar93._16_4_;
    auVar98._20_4_ = local_300._20_4_ * auVar93._20_4_;
    auVar98._24_4_ = local_300._24_4_ * auVar93._24_4_;
    auVar98._28_4_ = auVar93._28_4_;
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar85);
    auVar94 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar86);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar90,local_280);
    auVar90 = vfmadd231ps_avx512vl(auVar98,local_2a0,auVar90);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar81);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,auVar83);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar93,auVar87,auVar77);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar87,auVar78);
    auVar97 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar79);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar80,auVar87);
    auVar99._4_4_ = (fVar227 + fVar227) * fVar222;
    auVar99._0_4_ = (fVar226 + fVar226) * fVar205;
    auVar99._8_4_ = (fVar248 + fVar248) * fVar223;
    auVar99._12_4_ = (fVar249 + fVar249) * fVar224;
    auVar99._16_4_ = (fVar250 + fVar250) * 0.0;
    auVar99._20_4_ = (fVar180 + fVar180) * 0.0;
    auVar99._24_4_ = (fVar251 + fVar251) * 0.0;
    auVar99._28_4_ = auVar92._28_4_;
    auVar87 = vsubps_avx(auVar99,auVar265._0_32_);
    auVar110._0_28_ =
         ZEXT1628(CONCAT412((fVar224 + fVar224) * (fVar263 + -5.0) + fVar263 * fVar224,
                            CONCAT48((fVar223 + fVar223) * (fVar262 + -5.0) + fVar262 * fVar223,
                                     CONCAT44((fVar222 + fVar222) * (fVar261 + -5.0) +
                                              fVar261 * fVar222,
                                              (fVar205 + fVar205) * (fVar257 + -5.0) +
                                              fVar257 * fVar205))));
    auVar110._28_4_ = auVar260._28_4_ + -5.0 + 0.0;
    auVar88 = vaddps_avx512vl(auVar247._0_32_,auVar88);
    auVar100._4_4_ = (fVar227 + fVar227) * auVar88._4_4_;
    auVar100._0_4_ = (fVar226 + fVar226) * auVar88._0_4_;
    auVar100._8_4_ = (fVar248 + fVar248) * auVar88._8_4_;
    auVar100._12_4_ = (fVar249 + fVar249) * auVar88._12_4_;
    auVar100._16_4_ = (fVar250 + fVar250) * auVar88._16_4_;
    auVar100._20_4_ = (fVar180 + fVar180) * auVar88._20_4_;
    auVar100._24_4_ = (fVar251 + fVar251) * auVar88._24_4_;
    auVar100._28_4_ = auVar88._28_4_;
    auVar101._4_4_ = fVar227 * 3.0 * fVar227;
    auVar101._0_4_ = fVar226 * 3.0 * fVar226;
    auVar101._8_4_ = fVar248 * 3.0 * fVar248;
    auVar101._12_4_ = fVar249 * 3.0 * fVar249;
    auVar101._16_4_ = fVar250 * 3.0 * fVar250;
    auVar101._20_4_ = fVar180 * 3.0 * fVar180;
    auVar101._24_4_ = fVar251 * 3.0 * fVar251;
    auVar101._28_4_ = fVar225;
    auVar88 = vsubps_avx(auVar100,auVar101);
    auVar89 = vsubps_avx(auVar256._0_32_,auVar99);
    auVar93 = vmulps_avx512vl(auVar87,auVar91);
    auVar94 = vmulps_avx512vl(auVar110,auVar91);
    auVar88 = vmulps_avx512vl(auVar88,auVar91);
    auVar89 = vmulps_avx512vl(auVar89,auVar91);
    auVar91 = vmulps_avx512vl(local_2c0,auVar89);
    auVar102._4_4_ = local_2e0._4_4_ * auVar89._4_4_;
    auVar102._0_4_ = local_2e0._0_4_ * auVar89._0_4_;
    auVar102._8_4_ = local_2e0._8_4_ * auVar89._8_4_;
    auVar102._12_4_ = local_2e0._12_4_ * auVar89._12_4_;
    auVar102._16_4_ = local_2e0._16_4_ * auVar89._16_4_;
    auVar102._20_4_ = local_2e0._20_4_ * auVar89._20_4_;
    auVar102._24_4_ = local_2e0._24_4_ * auVar89._24_4_;
    auVar102._28_4_ = auVar87._28_4_;
    auVar87 = vmulps_avx512vl(local_220,auVar89);
    auVar103._4_4_ = local_300._4_4_ * auVar89._4_4_;
    auVar103._0_4_ = local_300._0_4_ * auVar89._0_4_;
    auVar103._8_4_ = local_300._8_4_ * auVar89._8_4_;
    auVar103._12_4_ = local_300._12_4_ * auVar89._12_4_;
    auVar103._16_4_ = local_300._16_4_ * auVar89._16_4_;
    auVar103._20_4_ = local_300._20_4_ * auVar89._20_4_;
    auVar103._24_4_ = local_300._24_4_ * auVar89._24_4_;
    auVar103._28_4_ = auVar89._28_4_;
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar85);
    auVar91 = vfmadd231ps_avx512vl(auVar102,auVar88,auVar86);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,local_280);
    auVar88 = vfmadd231ps_avx512vl(auVar103,local_2a0,auVar88);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar81);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar82);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar83);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,auVar94);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar77);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar78);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar79);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar93);
    auVar117._4_4_ = auVar89._4_4_ * fVar228;
    auVar117._0_4_ = auVar89._0_4_ * fVar228;
    auVar117._8_4_ = auVar89._8_4_ * fVar228;
    auVar117._12_4_ = auVar89._12_4_ * fVar228;
    auVar117._16_4_ = auVar89._16_4_ * fVar228;
    auVar117._20_4_ = auVar89._20_4_ * fVar228;
    auVar117._24_4_ = auVar89._24_4_ * fVar228;
    auVar117._28_4_ = fVar225 + fVar225;
    auVar118._4_4_ = auVar91._4_4_ * fVar228;
    auVar118._0_4_ = auVar91._0_4_ * fVar228;
    auVar118._8_4_ = auVar91._8_4_ * fVar228;
    auVar118._12_4_ = auVar91._12_4_ * fVar228;
    auVar118._16_4_ = auVar91._16_4_ * fVar228;
    auVar118._20_4_ = auVar91._20_4_ * fVar228;
    auVar118._24_4_ = auVar91._24_4_ * fVar228;
    auVar118._28_4_ = auVar92._28_4_;
    auVar119._4_4_ = auVar87._4_4_ * fVar228;
    auVar119._0_4_ = auVar87._0_4_ * fVar228;
    auVar119._8_4_ = auVar87._8_4_ * fVar228;
    auVar119._12_4_ = auVar87._12_4_ * fVar228;
    auVar119._16_4_ = auVar87._16_4_ * fVar228;
    auVar119._20_4_ = auVar87._20_4_ * fVar228;
    auVar119._24_4_ = auVar87._24_4_ * fVar228;
    auVar119._28_4_ = 0;
    fVar205 = fVar228 * auVar88._0_4_;
    fVar222 = fVar228 * auVar88._4_4_;
    auVar107._4_4_ = fVar222;
    auVar107._0_4_ = fVar205;
    fVar223 = fVar228 * auVar88._8_4_;
    auVar107._8_4_ = fVar223;
    fVar224 = fVar228 * auVar88._12_4_;
    auVar107._12_4_ = fVar224;
    fVar225 = fVar228 * auVar88._16_4_;
    auVar107._16_4_ = fVar225;
    fVar226 = fVar228 * auVar88._20_4_;
    auVar107._20_4_ = fVar226;
    fVar227 = fVar228 * auVar88._24_4_;
    auVar107._24_4_ = fVar227;
    auVar107._28_4_ = fVar228;
    auVar68 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar68));
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar68));
    auVar264 = ZEXT3264(auVar99);
    auVar89 = ZEXT1632(auVar68);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar89);
    auVar267 = ZEXT3264(auVar100);
    auVar111._0_4_ = auVar90._0_4_ + fVar205;
    auVar111._4_4_ = auVar90._4_4_ + fVar222;
    auVar111._8_4_ = auVar90._8_4_ + fVar223;
    auVar111._12_4_ = auVar90._12_4_ + fVar224;
    auVar111._16_4_ = auVar90._16_4_ + fVar225;
    auVar111._20_4_ = auVar90._20_4_ + fVar226;
    auVar111._24_4_ = auVar90._24_4_ + fVar227;
    auVar111._28_4_ = auVar90._28_4_ + fVar228;
    auVar87 = vmaxps_avx(auVar90,auVar111);
    auVar88 = vminps_avx(auVar90,auVar111);
    auVar93 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,auVar89);
    auVar101 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar89);
    auVar260 = ZEXT3264(auVar101);
    auVar102 = vpermt2ps_avx512vl(auVar118,_DAT_01feed00,auVar89);
    auVar113 = ZEXT1632(auVar68);
    auVar103 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar113);
    auVar89 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar113);
    auVar94 = vsubps_avx512vl(auVar93,auVar89);
    auVar89 = vsubps_avx(auVar98,auVar95);
    auVar256 = ZEXT3264(auVar89);
    auVar90 = vsubps_avx(auVar99,auVar96);
    auVar92 = vsubps_avx(auVar100,auVar97);
    auVar91 = vmulps_avx512vl(auVar90,auVar119);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar118,auVar92);
    auVar104 = vmulps_avx512vl(auVar92,auVar117);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar119,auVar89);
    auVar105 = vmulps_avx512vl(auVar89,auVar118);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar117,auVar90);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar91,auVar91);
    auVar91 = vmulps_avx512vl(auVar92,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar90);
    auVar105 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar89);
    auVar106 = vrcp14ps_avx512vl(auVar105);
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = 0x3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar91 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar91);
    auVar91 = vfmadd132ps_avx512vl(auVar91,auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar91);
    auVar106 = vmulps_avx512vl(auVar90,auVar103);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar102,auVar92);
    auVar107 = vmulps_avx512vl(auVar92,auVar101);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar103,auVar89);
    auVar108 = vmulps_avx512vl(auVar89,auVar102);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar101,auVar90);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar91 = vmulps_avx512vl(auVar106,auVar91);
    auVar91 = vmaxps_avx512vl(auVar104,auVar91);
    auVar91 = vsqrtps_avx512vl(auVar91);
    auVar104 = vmaxps_avx512vl(auVar94,auVar93);
    auVar87 = vmaxps_avx512vl(auVar87,auVar104);
    auVar106 = vaddps_avx512vl(auVar91,auVar87);
    auVar87 = vminps_avx512vl(auVar94,auVar93);
    auVar87 = vminps_avx(auVar88,auVar87);
    auVar87 = vsubps_avx512vl(auVar87,auVar91);
    auVar93._8_4_ = 0x3f800002;
    auVar93._0_8_ = 0x3f8000023f800002;
    auVar93._12_4_ = 0x3f800002;
    auVar93._16_4_ = 0x3f800002;
    auVar93._20_4_ = 0x3f800002;
    auVar93._24_4_ = 0x3f800002;
    auVar93._28_4_ = 0x3f800002;
    auVar88 = vmulps_avx512vl(auVar106,auVar93);
    auVar94._8_4_ = 0x3f7ffffc;
    auVar94._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar94._12_4_ = 0x3f7ffffc;
    auVar94._16_4_ = 0x3f7ffffc;
    auVar94._20_4_ = 0x3f7ffffc;
    auVar94._24_4_ = 0x3f7ffffc;
    auVar94._28_4_ = 0x3f7ffffc;
    auVar87 = vmulps_avx512vl(auVar87,auVar94);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    auVar91 = vrsqrt14ps_avx512vl(auVar105);
    auVar104._8_4_ = 0xbf000000;
    auVar104._0_8_ = 0xbf000000bf000000;
    auVar104._12_4_ = 0xbf000000;
    auVar104._16_4_ = 0xbf000000;
    auVar104._20_4_ = 0xbf000000;
    auVar104._24_4_ = 0xbf000000;
    auVar104._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar105,auVar104);
    fVar228 = auVar91._0_4_;
    fVar205 = auVar91._4_4_;
    fVar222 = auVar91._8_4_;
    fVar223 = auVar91._12_4_;
    fVar224 = auVar91._16_4_;
    fVar225 = auVar91._20_4_;
    fVar226 = auVar91._24_4_;
    auVar108._4_4_ = fVar205 * fVar205 * fVar205 * auVar93._4_4_;
    auVar108._0_4_ = fVar228 * fVar228 * fVar228 * auVar93._0_4_;
    auVar108._8_4_ = fVar222 * fVar222 * fVar222 * auVar93._8_4_;
    auVar108._12_4_ = fVar223 * fVar223 * fVar223 * auVar93._12_4_;
    auVar108._16_4_ = fVar224 * fVar224 * fVar224 * auVar93._16_4_;
    auVar108._20_4_ = fVar225 * fVar225 * fVar225 * auVar93._20_4_;
    auVar108._24_4_ = fVar226 * fVar226 * fVar226 * auVar93._24_4_;
    auVar108._28_4_ = auVar106._28_4_;
    auVar105._8_4_ = 0x3fc00000;
    auVar105._0_8_ = 0x3fc000003fc00000;
    auVar105._12_4_ = 0x3fc00000;
    auVar105._16_4_ = 0x3fc00000;
    auVar105._20_4_ = 0x3fc00000;
    auVar105._24_4_ = 0x3fc00000;
    auVar105._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar108,auVar91,auVar105);
    auVar93 = vmulps_avx512vl(auVar89,auVar91);
    auVar94 = vmulps_avx512vl(auVar90,auVar91);
    auVar104 = vmulps_avx512vl(auVar92,auVar91);
    auVar105 = vsubps_avx512vl(auVar113,auVar95);
    auVar107 = vsubps_avx512vl(auVar113,auVar96);
    auVar108 = vsubps_avx512vl(auVar113,auVar97);
    auVar106 = vmulps_avx512vl(local_600,auVar108);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_5e0,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar106,_local_5c0,auVar105);
    auVar109 = vmulps_avx512vl(auVar108,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar110 = vmulps_avx512vl(local_600,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar94,local_5e0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar93,_local_5c0);
    auVar104 = vmulps_avx512vl(auVar108,auVar104);
    auVar94 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar93);
    auVar94 = vmulps_avx512vl(auVar110,auVar110);
    auVar104 = vsubps_avx512vl(local_240,auVar94);
    auVar111 = vmulps_avx512vl(auVar110,auVar93);
    auVar106 = vsubps_avx512vl(auVar106,auVar111);
    auVar111 = vaddps_avx512vl(auVar106,auVar106);
    auVar106 = vmulps_avx512vl(auVar93,auVar93);
    local_720 = vsubps_avx512vl(auVar109,auVar106);
    auVar88 = vsubps_avx512vl(local_720,auVar88);
    auVar109 = vmulps_avx512vl(auVar111,auVar111);
    auVar106._8_4_ = 0x40800000;
    auVar106._0_8_ = 0x4080000040800000;
    auVar106._12_4_ = 0x40800000;
    auVar106._16_4_ = 0x40800000;
    auVar106._20_4_ = 0x40800000;
    auVar106._24_4_ = 0x40800000;
    auVar106._28_4_ = 0x40800000;
    _local_620 = vmulps_avx512vl(auVar104,auVar106);
    auVar106 = vmulps_avx512vl(_local_620,auVar88);
    auVar106 = vsubps_avx512vl(auVar109,auVar106);
    uVar61 = vcmpps_avx512vl(auVar106,auVar113,5);
    bVar48 = (byte)uVar61;
    if (bVar48 != 0) {
      auVar106 = vsqrtps_avx512vl(auVar106);
      auVar112 = vaddps_avx512vl(auVar104,auVar104);
      local_640 = vrcp14ps_avx512vl(auVar112);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = 0x3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar113._16_4_ = 0x3f800000;
      auVar113._20_4_ = 0x3f800000;
      auVar113._24_4_ = 0x3f800000;
      auVar113._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_avx512vl(local_640,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_640,local_640);
      auVar114._8_4_ = 0x80000000;
      auVar114._0_8_ = 0x8000000080000000;
      auVar114._12_4_ = 0x80000000;
      auVar114._16_4_ = 0x80000000;
      auVar114._20_4_ = 0x80000000;
      auVar114._24_4_ = 0x80000000;
      auVar114._28_4_ = 0x80000000;
      local_660 = vxorps_avx512vl(auVar111,auVar114);
      auVar114 = vsubps_avx512vl(local_660,auVar106);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar106 = vsubps_avx512vl(auVar106,auVar111);
      local_680 = vmulps_avx512vl(auVar106,auVar113);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar106,auVar114);
      auVar115._0_4_ =
           (uint)(bVar48 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar106._0_4_;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * auVar106._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * auVar106._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * auVar106._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * auVar106._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * auVar106._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * auVar106._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar115._28_4_ = (uint)bVar60 * auVar113._28_4_ | (uint)!bVar60 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar106,local_680);
      auVar116._0_4_ =
           (uint)(bVar48 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar106._0_4_;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * auVar106._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * auVar106._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * auVar106._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * auVar106._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * auVar106._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * auVar106._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar116._28_4_ = (uint)bVar60 * auVar113._28_4_ | (uint)!bVar60 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar106);
      local_7e0 = vmaxps_avx512vl(local_260,auVar106);
      auVar122._8_4_ = 0x36000000;
      auVar122._0_8_ = 0x3600000036000000;
      auVar122._12_4_ = 0x36000000;
      auVar122._16_4_ = 0x36000000;
      auVar122._20_4_ = 0x36000000;
      auVar122._24_4_ = 0x36000000;
      auVar122._28_4_ = 0x36000000;
      local_800 = vmulps_avx512vl(local_7e0,auVar122);
      vandps_avx512vl(auVar104,auVar106);
      uVar51 = vcmpps_avx512vl(local_800,local_800,1);
      uVar61 = uVar61 & uVar51;
      bVar55 = (byte)uVar61;
      if (bVar55 != 0) {
        uVar51 = vcmpps_avx512vl(auVar88,_DAT_01faff00,2);
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar88,auVar94);
        bVar52 = (byte)uVar51;
        uVar63 = (uint)(bVar52 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar52 & 1) * local_800._0_4_;
        bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
        uVar62 = (uint)bVar60 * auVar104._4_4_ | (uint)!bVar60 * local_800._4_4_;
        bVar60 = (bool)((byte)(uVar51 >> 2) & 1);
        uVar136 = (uint)bVar60 * auVar104._8_4_ | (uint)!bVar60 * local_800._8_4_;
        bVar60 = (bool)((byte)(uVar51 >> 3) & 1);
        uVar137 = (uint)bVar60 * auVar104._12_4_ | (uint)!bVar60 * local_800._12_4_;
        bVar60 = (bool)((byte)(uVar51 >> 4) & 1);
        uVar138 = (uint)bVar60 * auVar104._16_4_ | (uint)!bVar60 * local_800._16_4_;
        bVar60 = (bool)((byte)(uVar51 >> 5) & 1);
        uVar139 = (uint)bVar60 * auVar104._20_4_ | (uint)!bVar60 * local_800._20_4_;
        bVar60 = (bool)((byte)(uVar51 >> 6) & 1);
        uVar140 = (uint)bVar60 * auVar104._24_4_ | (uint)!bVar60 * local_800._24_4_;
        bVar60 = SUB81(uVar51 >> 7,0);
        uVar141 = (uint)bVar60 * auVar104._28_4_ | (uint)!bVar60 * local_800._28_4_;
        auVar115._0_4_ = (bVar55 & 1) * uVar63 | !(bool)(bVar55 & 1) * auVar115._0_4_;
        bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar115._4_4_ = bVar60 * uVar62 | !bVar60 * auVar115._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar115._8_4_ = bVar60 * uVar136 | !bVar60 * auVar115._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar115._12_4_ = bVar60 * uVar137 | !bVar60 * auVar115._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar115._16_4_ = bVar60 * uVar138 | !bVar60 * auVar115._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar115._20_4_ = bVar60 * uVar139 | !bVar60 * auVar115._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar115._24_4_ = bVar60 * uVar140 | !bVar60 * auVar115._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar115._28_4_ = bVar60 * uVar141 | !bVar60 * auVar115._28_4_;
        auVar88 = vblendmps_avx512vl(auVar94,auVar88);
        bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar51 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar51 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar51 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar51 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar51 >> 6) & 1);
        bVar10 = SUB81(uVar51 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar52 & 1) * auVar88._0_4_ | !(bool)(bVar52 & 1) * uVar63) |
             !(bool)(bVar55 & 1) * auVar116._0_4_;
        bVar4 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar4 * ((uint)bVar60 * auVar88._4_4_ | !bVar60 * uVar62) |
             !bVar4 * auVar116._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar60 * ((uint)bVar5 * auVar88._8_4_ | !bVar5 * uVar136) |
             !bVar60 * auVar116._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar60 * ((uint)bVar6 * auVar88._12_4_ | !bVar6 * uVar137) |
             !bVar60 * auVar116._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar60 * ((uint)bVar7 * auVar88._16_4_ | !bVar7 * uVar138) |
             !bVar60 * auVar116._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar60 * ((uint)bVar8 * auVar88._20_4_ | !bVar8 * uVar139) |
             !bVar60 * auVar116._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar60 * ((uint)bVar9 * auVar88._24_4_ | !bVar9 * uVar140) |
             !bVar60 * auVar116._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar60 * ((uint)bVar10 * auVar88._28_4_ | !bVar10 * uVar141) |
             !bVar60 * auVar116._28_4_;
        bVar48 = (~bVar55 | bVar52) & bVar48;
      }
      if ((bVar48 & 0x7f) != 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar103 = vxorps_avx512vl(auVar103,auVar106);
        auVar101 = vxorps_avx512vl(auVar101,auVar106);
        uVar63 = *(uint *)(ray + k * 4 + 0x100);
        auVar102 = vxorps_avx512vl(auVar102,auVar106);
        auVar68 = vsubss_avx512f(ZEXT416(uVar63),ZEXT416((uint)local_6d0._0_4_));
        auVar88 = vbroadcastss_avx512vl(auVar68);
        auVar113 = vminps_avx512vl(auVar88,auVar116);
        auVar47._4_4_ = fStack_31c;
        auVar47._0_4_ = local_320;
        auVar47._8_4_ = fStack_318;
        auVar47._12_4_ = fStack_314;
        auVar47._16_4_ = fStack_310;
        auVar47._20_4_ = fStack_30c;
        auVar47._24_4_ = fStack_308;
        auVar47._28_4_ = fStack_304;
        auVar88 = vmaxps_avx512vl(auVar47,auVar115);
        auVar94 = vmulps_avx512vl(auVar108,auVar119);
        auVar94 = vfmadd213ps_avx512vl(auVar107,auVar118,auVar94);
        auVar68 = vfmadd213ps_fma(auVar105,auVar117,auVar94);
        auVar94 = vmulps_avx512vl(local_600,auVar119);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_5e0,auVar118);
        auVar70 = vfmadd231ps_fma(auVar94,_local_5c0,auVar117);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar70),auVar105);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar105,auVar117,1);
        auVar94 = vxorps_avx512vl(ZEXT1632(auVar68),auVar106);
        auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar70));
        auVar122 = ZEXT1632(auVar70);
        auVar118 = vxorps_avx512vl(auVar122,auVar106);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar107 = vfnmadd213ps_avx512vl(auVar104,auVar122,auVar119);
        auVar68 = vfmadd132ps_fma(auVar107,auVar104,auVar104);
        fVar228 = auVar68._0_4_ * auVar94._0_4_;
        fVar205 = auVar68._4_4_ * auVar94._4_4_;
        auVar30._4_4_ = fVar205;
        auVar30._0_4_ = fVar228;
        fVar222 = auVar68._8_4_ * auVar94._8_4_;
        auVar30._8_4_ = fVar222;
        fVar223 = auVar68._12_4_ * auVar94._12_4_;
        auVar30._12_4_ = fVar223;
        fVar224 = auVar94._16_4_ * 0.0;
        auVar30._16_4_ = fVar224;
        fVar225 = auVar94._20_4_ * 0.0;
        auVar30._20_4_ = fVar225;
        fVar226 = auVar94._24_4_ * 0.0;
        auVar30._24_4_ = fVar226;
        auVar30._28_4_ = auVar94._28_4_;
        uVar13 = vcmpps_avx512vl(auVar122,auVar118,1);
        bVar55 = (byte)uVar12 | (byte)uVar13;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar30,auVar107);
        auVar120._0_4_ =
             (uint)(bVar55 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar104._0_4_;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar60 * auVar108._4_4_ | (uint)!bVar60 * auVar104._4_4_;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar60 * auVar108._8_4_ | (uint)!bVar60 * auVar104._8_4_;
        bVar60 = (bool)(bVar55 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar60 * auVar108._12_4_ | (uint)!bVar60 * auVar104._12_4_;
        bVar60 = (bool)(bVar55 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar60 * auVar108._16_4_ | (uint)!bVar60 * auVar104._16_4_;
        bVar60 = (bool)(bVar55 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar60 * auVar108._20_4_ | (uint)!bVar60 * auVar104._20_4_;
        bVar60 = (bool)(bVar55 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar60 * auVar108._24_4_ | (uint)!bVar60 * auVar104._24_4_;
        auVar120._28_4_ =
             (uint)(bVar55 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar104._28_4_;
        auVar108 = vmaxps_avx512vl(auVar88,auVar120);
        uVar13 = vcmpps_avx512vl(auVar122,auVar118,6);
        bVar55 = (byte)uVar12 | (byte)uVar13;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121._0_4_ =
             (uint)(bVar55 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar228;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar60 * auVar118._4_4_ | (uint)!bVar60 * (int)fVar205;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar60 * auVar118._8_4_ | (uint)!bVar60 * (int)fVar222;
        bVar60 = (bool)(bVar55 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar60 * auVar118._12_4_ | (uint)!bVar60 * (int)fVar223;
        bVar60 = (bool)(bVar55 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar60 * auVar118._16_4_ | (uint)!bVar60 * (int)fVar224;
        bVar60 = (bool)(bVar55 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar60 * auVar118._20_4_ | (uint)!bVar60 * (int)fVar225;
        bVar60 = (bool)(bVar55 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar60 * auVar118._24_4_ | (uint)!bVar60 * (int)fVar226;
        auVar121._28_4_ =
             (uint)(bVar55 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar94._28_4_;
        auVar122 = vminps_avx512vl(auVar113,auVar121);
        auVar88 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
        auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
        auVar98 = ZEXT832(0) << 0x20;
        auVar104 = vsubps_avx(auVar98,auVar100);
        auVar104 = vmulps_avx512vl(auVar104,auVar103);
        auVar94 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar94);
        auVar88 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar88);
        auVar94 = vmulps_avx512vl(local_600,auVar103);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_5e0,auVar102);
        auVar94 = vfmadd231ps_avx512vl(auVar94,_local_5c0,auVar101);
        vandps_avx512vl(auVar94,auVar105);
        uVar12 = vcmpps_avx512vl(auVar94,auVar117,1);
        auVar88 = vxorps_avx512vl(auVar88,auVar106);
        auVar104 = vrcp14ps_avx512vl(auVar94);
        auVar105 = vxorps_avx512vl(auVar94,auVar106);
        auVar267 = ZEXT3264(auVar105);
        auVar106 = vfnmadd213ps_avx512vl(auVar104,auVar94,auVar119);
        auVar68 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
        fVar228 = auVar68._0_4_ * auVar88._0_4_;
        fVar205 = auVar68._4_4_ * auVar88._4_4_;
        auVar31._4_4_ = fVar205;
        auVar31._0_4_ = fVar228;
        fVar222 = auVar68._8_4_ * auVar88._8_4_;
        auVar31._8_4_ = fVar222;
        fVar223 = auVar68._12_4_ * auVar88._12_4_;
        auVar31._12_4_ = fVar223;
        fVar224 = auVar88._16_4_ * 0.0;
        auVar31._16_4_ = fVar224;
        fVar225 = auVar88._20_4_ * 0.0;
        auVar31._20_4_ = fVar225;
        fVar226 = auVar88._24_4_ * 0.0;
        auVar31._24_4_ = fVar226;
        auVar31._28_4_ = auVar88._28_4_;
        uVar13 = vcmpps_avx512vl(auVar94,auVar105,1);
        bVar55 = (byte)uVar12 | (byte)uVar13;
        auVar106 = vblendmps_avx512vl(auVar31,auVar107);
        auVar123._0_4_ =
             (uint)(bVar55 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar104._0_4_;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar60 * auVar106._4_4_ | (uint)!bVar60 * auVar104._4_4_;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar60 * auVar106._8_4_ | (uint)!bVar60 * auVar104._8_4_;
        bVar60 = (bool)(bVar55 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar60 * auVar106._12_4_ | (uint)!bVar60 * auVar104._12_4_;
        bVar60 = (bool)(bVar55 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar60 * auVar106._16_4_ | (uint)!bVar60 * auVar104._16_4_;
        bVar60 = (bool)(bVar55 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar60 * auVar106._20_4_ | (uint)!bVar60 * auVar104._20_4_;
        bVar60 = (bool)(bVar55 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar60 * auVar106._24_4_ | (uint)!bVar60 * auVar104._24_4_;
        auVar123._28_4_ =
             (uint)(bVar55 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar104._28_4_;
        auVar264 = ZEXT3264(auVar123);
        _local_820 = vmaxps_avx(auVar108,auVar123);
        auVar260 = ZEXT3264(_local_820);
        uVar13 = vcmpps_avx512vl(auVar94,auVar105,6);
        bVar55 = (byte)uVar12 | (byte)uVar13;
        auVar124._0_4_ =
             (uint)(bVar55 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar228;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar60 * auVar118._4_4_ | (uint)!bVar60 * (int)fVar205;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar60 * auVar118._8_4_ | (uint)!bVar60 * (int)fVar222;
        bVar60 = (bool)(bVar55 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar60 * auVar118._12_4_ | (uint)!bVar60 * (int)fVar223;
        bVar60 = (bool)(bVar55 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar60 * auVar118._16_4_ | (uint)!bVar60 * (int)fVar224;
        bVar60 = (bool)(bVar55 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar60 * auVar118._20_4_ | (uint)!bVar60 * (int)fVar225;
        bVar60 = (bool)(bVar55 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar60 * auVar118._24_4_ | (uint)!bVar60 * (int)fVar226;
        auVar124._28_4_ =
             (uint)(bVar55 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar88._28_4_;
        local_380 = vminps_avx(auVar122,auVar124);
        uVar12 = vcmpps_avx512vl(_local_820,local_380,2);
        bVar48 = bVar48 & 0x7f & (byte)uVar12;
        if (bVar48 != 0) {
          auVar87 = vmaxps_avx(auVar98,auVar87);
          auVar88 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar93);
          fVar228 = auVar91._0_4_;
          fVar205 = auVar91._4_4_;
          auVar32._4_4_ = fVar205 * auVar88._4_4_;
          auVar32._0_4_ = fVar228 * auVar88._0_4_;
          fVar222 = auVar91._8_4_;
          auVar32._8_4_ = fVar222 * auVar88._8_4_;
          fVar223 = auVar91._12_4_;
          auVar32._12_4_ = fVar223 * auVar88._12_4_;
          fVar224 = auVar91._16_4_;
          auVar32._16_4_ = fVar224 * auVar88._16_4_;
          fVar225 = auVar91._20_4_;
          auVar32._20_4_ = fVar225 * auVar88._20_4_;
          fVar226 = auVar91._24_4_;
          auVar32._24_4_ = fVar226 * auVar88._24_4_;
          auVar32._28_4_ = auVar88._28_4_;
          auVar88 = vfmadd213ps_avx512vl(local_680,auVar110,auVar93);
          auVar33._4_4_ = fVar205 * auVar88._4_4_;
          auVar33._0_4_ = fVar228 * auVar88._0_4_;
          auVar33._8_4_ = fVar222 * auVar88._8_4_;
          auVar33._12_4_ = fVar223 * auVar88._12_4_;
          auVar33._16_4_ = fVar224 * auVar88._16_4_;
          auVar33._20_4_ = fVar225 * auVar88._20_4_;
          auVar33._24_4_ = fVar226 * auVar88._24_4_;
          auVar33._28_4_ = auVar123._28_4_;
          auVar88 = vminps_avx512vl(auVar32,auVar119);
          auVar42 = ZEXT812(0);
          auVar94 = ZEXT1232(auVar42) << 0x20;
          auVar88 = vmaxps_avx(auVar88,ZEXT1232(auVar42) << 0x20);
          auVar104 = vminps_avx512vl(auVar33,auVar119);
          auVar34._4_4_ = (auVar88._4_4_ + 1.0) * 0.125;
          auVar34._0_4_ = (auVar88._0_4_ + 0.0) * 0.125;
          auVar34._8_4_ = (auVar88._8_4_ + 2.0) * 0.125;
          auVar34._12_4_ = (auVar88._12_4_ + 3.0) * 0.125;
          auVar34._16_4_ = (auVar88._16_4_ + 4.0) * 0.125;
          auVar34._20_4_ = (auVar88._20_4_ + 5.0) * 0.125;
          auVar34._24_4_ = (auVar88._24_4_ + 6.0) * 0.125;
          auVar34._28_4_ = auVar88._28_4_ + 7.0;
          local_1e0 = vfmadd213ps_avx512vl(auVar34,auVar153,auVar233);
          auVar88 = vmaxps_avx(auVar104,ZEXT1232(auVar42) << 0x20);
          auVar35._4_4_ = (auVar88._4_4_ + 1.0) * 0.125;
          auVar35._0_4_ = (auVar88._0_4_ + 0.0) * 0.125;
          auVar35._8_4_ = (auVar88._8_4_ + 2.0) * 0.125;
          auVar35._12_4_ = (auVar88._12_4_ + 3.0) * 0.125;
          auVar35._16_4_ = (auVar88._16_4_ + 4.0) * 0.125;
          auVar35._20_4_ = (auVar88._20_4_ + 5.0) * 0.125;
          auVar35._24_4_ = (auVar88._24_4_ + 6.0) * 0.125;
          auVar35._28_4_ = auVar88._28_4_ + 7.0;
          local_200 = vfmadd213ps_avx512vl(auVar35,auVar153,auVar233);
          auVar36._4_4_ = auVar87._4_4_ * auVar87._4_4_;
          auVar36._0_4_ = auVar87._0_4_ * auVar87._0_4_;
          auVar36._8_4_ = auVar87._8_4_ * auVar87._8_4_;
          auVar36._12_4_ = auVar87._12_4_ * auVar87._12_4_;
          auVar36._16_4_ = auVar87._16_4_ * auVar87._16_4_;
          auVar36._20_4_ = auVar87._20_4_ * auVar87._20_4_;
          auVar36._24_4_ = auVar87._24_4_ * auVar87._24_4_;
          auVar36._28_4_ = auVar87._28_4_;
          auVar88 = vsubps_avx(local_720,auVar36);
          auVar37._4_4_ = auVar88._4_4_ * (float)local_620._4_4_;
          auVar37._0_4_ = auVar88._0_4_ * (float)local_620._0_4_;
          auVar37._8_4_ = auVar88._8_4_ * fStack_618;
          auVar37._12_4_ = auVar88._12_4_ * fStack_614;
          auVar37._16_4_ = auVar88._16_4_ * fStack_610;
          auVar37._20_4_ = auVar88._20_4_ * fStack_60c;
          auVar37._24_4_ = auVar88._24_4_ * fStack_608;
          auVar37._28_4_ = auVar87._28_4_;
          auVar87 = vsubps_avx(auVar109,auVar37);
          uVar12 = vcmpps_avx512vl(auVar87,ZEXT1232(auVar42) << 0x20,5);
          bVar55 = (byte)uVar12;
          if (bVar55 == 0) {
            bVar55 = 0;
            auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar256 = ZEXT864(0) << 0x20;
            auVar87 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar264 = ZEXT864(0) << 0x20;
            auVar112._8_4_ = 0x7f800000;
            auVar112._0_8_ = 0x7f8000007f800000;
            auVar112._12_4_ = 0x7f800000;
            auVar112._16_4_ = 0x7f800000;
            auVar112._20_4_ = 0x7f800000;
            auVar112._24_4_ = 0x7f800000;
            auVar112._28_4_ = 0x7f800000;
            auVar125._8_4_ = 0xff800000;
            auVar125._0_8_ = 0xff800000ff800000;
            auVar125._12_4_ = 0xff800000;
            auVar125._16_4_ = 0xff800000;
            auVar125._20_4_ = 0xff800000;
            auVar125._24_4_ = 0xff800000;
            auVar125._28_4_ = 0xff800000;
          }
          else {
            auVar70 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
            uVar61 = vcmpps_avx512vl(auVar87,auVar98,5);
            auVar87 = vsqrtps_avx(auVar87);
            auVar94 = vfnmadd213ps_avx512vl(auVar112,local_640,auVar119);
            auVar105 = vfmadd132ps_avx512vl(auVar94,local_640,local_640);
            auVar94 = vsubps_avx(local_660,auVar87);
            auVar106 = vmulps_avx512vl(auVar94,auVar105);
            auVar87 = vsubps_avx512vl(auVar87,auVar111);
            auVar105 = vmulps_avx512vl(auVar87,auVar105);
            auVar87 = vfmadd213ps_avx512vl(auVar110,auVar106,auVar93);
            auVar38._4_4_ = fVar205 * auVar87._4_4_;
            auVar38._0_4_ = fVar228 * auVar87._0_4_;
            auVar38._8_4_ = fVar222 * auVar87._8_4_;
            auVar38._12_4_ = fVar223 * auVar87._12_4_;
            auVar38._16_4_ = fVar224 * auVar87._16_4_;
            auVar38._20_4_ = fVar225 * auVar87._20_4_;
            auVar38._24_4_ = fVar226 * auVar87._24_4_;
            auVar38._28_4_ = auVar104._28_4_;
            auVar39._4_4_ = (float)local_5c0._4_4_ * auVar106._4_4_;
            auVar39._0_4_ = (float)local_5c0._0_4_ * auVar106._0_4_;
            auVar39._8_4_ = fStack_5b8 * auVar106._8_4_;
            auVar39._12_4_ = fStack_5b4 * auVar106._12_4_;
            auVar39._16_4_ = fStack_5b0 * auVar106._16_4_;
            auVar39._20_4_ = fStack_5ac * auVar106._20_4_;
            auVar39._24_4_ = fStack_5a8 * auVar106._24_4_;
            auVar39._28_4_ = auVar87._28_4_;
            auVar94 = vmulps_avx512vl(local_5e0,auVar106);
            auVar98 = vmulps_avx512vl(local_600,auVar106);
            auVar87 = vfmadd213ps_avx512vl(auVar89,auVar38,auVar95);
            auVar87 = vsubps_avx512vl(auVar39,auVar87);
            auVar104 = vfmadd213ps_avx512vl(auVar90,auVar38,auVar96);
            auVar104 = vsubps_avx512vl(auVar94,auVar104);
            auVar68 = vfmadd213ps_fma(auVar38,auVar92,auVar97);
            auVar94 = vsubps_avx(auVar98,ZEXT1632(auVar68));
            auVar264 = ZEXT3264(auVar94);
            auVar93 = vfmadd213ps_avx512vl(auVar110,auVar105,auVar93);
            auVar91 = vmulps_avx512vl(auVar91,auVar93);
            auVar40._4_4_ = (float)local_5c0._4_4_ * auVar105._4_4_;
            auVar40._0_4_ = (float)local_5c0._0_4_ * auVar105._0_4_;
            auVar40._8_4_ = fStack_5b8 * auVar105._8_4_;
            auVar40._12_4_ = fStack_5b4 * auVar105._12_4_;
            auVar40._16_4_ = fStack_5b0 * auVar105._16_4_;
            auVar40._20_4_ = fStack_5ac * auVar105._20_4_;
            auVar40._24_4_ = fStack_5a8 * auVar105._24_4_;
            auVar40._28_4_ = auVar98._28_4_;
            auVar93 = vmulps_avx512vl(local_5e0,auVar105);
            auVar98 = vmulps_avx512vl(local_600,auVar105);
            auVar68 = vfmadd213ps_fma(auVar89,auVar91,auVar95);
            auVar94 = vsubps_avx(auVar40,ZEXT1632(auVar68));
            auVar68 = vfmadd213ps_fma(auVar90,auVar91,auVar96);
            auVar89 = vsubps_avx512vl(auVar93,ZEXT1632(auVar68));
            auVar68 = vfmadd213ps_fma(auVar92,auVar91,auVar97);
            auVar90 = vsubps_avx512vl(auVar98,ZEXT1632(auVar68));
            auVar256 = ZEXT3264(auVar90);
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar90 = vblendmps_avx512vl(auVar154,auVar106);
            bVar60 = (bool)((byte)uVar61 & 1);
            auVar112._0_4_ = (uint)bVar60 * auVar90._0_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar60 * auVar90._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar60 * auVar90._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar60 * auVar90._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar112._16_4_ = (uint)bVar60 * auVar90._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar112._20_4_ = (uint)bVar60 * auVar90._20_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar112._24_4_ = (uint)bVar60 * auVar90._24_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = SUB81(uVar61 >> 7,0);
            auVar112._28_4_ = (uint)bVar60 * auVar90._28_4_ | (uint)!bVar60 * 0x7f800000;
            auVar201._8_4_ = 0xff800000;
            auVar201._0_8_ = 0xff800000ff800000;
            auVar201._12_4_ = 0xff800000;
            auVar201._16_4_ = 0xff800000;
            auVar201._20_4_ = 0xff800000;
            auVar201._24_4_ = 0xff800000;
            auVar201._28_4_ = 0xff800000;
            auVar90 = vblendmps_avx512vl(auVar201,auVar105);
            bVar60 = (bool)((byte)uVar61 & 1);
            auVar125._0_4_ = (uint)bVar60 * auVar90._0_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar60 * auVar90._4_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar60 * auVar90._8_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar60 * auVar90._12_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar60 * auVar90._16_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar60 * auVar90._20_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar60 * auVar90._24_4_ | (uint)!bVar60 * -0x800000;
            bVar60 = SUB81(uVar61 >> 7,0);
            auVar125._28_4_ = (uint)bVar60 * auVar90._28_4_ | (uint)!bVar60 * -0x800000;
            auVar26._8_4_ = 0x36000000;
            auVar26._0_8_ = 0x3600000036000000;
            auVar26._12_4_ = 0x36000000;
            auVar26._16_4_ = 0x36000000;
            auVar26._20_4_ = 0x36000000;
            auVar26._24_4_ = 0x36000000;
            auVar26._28_4_ = 0x36000000;
            auVar90 = vmulps_avx512vl(local_7e0,auVar26);
            uVar51 = vcmpps_avx512vl(auVar90,local_800,0xe);
            uVar61 = uVar61 & uVar51;
            bVar52 = (byte)uVar61;
            if (bVar52 != 0) {
              uVar51 = vcmpps_avx512vl(auVar88,ZEXT1632(auVar70),2);
              auVar255._8_4_ = 0x7f800000;
              auVar255._0_8_ = 0x7f8000007f800000;
              auVar255._12_4_ = 0x7f800000;
              auVar255._16_4_ = 0x7f800000;
              auVar255._20_4_ = 0x7f800000;
              auVar255._24_4_ = 0x7f800000;
              auVar255._28_4_ = 0x7f800000;
              auVar271._8_4_ = 0xff800000;
              auVar271._0_8_ = 0xff800000ff800000;
              auVar271._12_4_ = 0xff800000;
              auVar271._16_4_ = 0xff800000;
              auVar271._20_4_ = 0xff800000;
              auVar271._24_4_ = 0xff800000;
              auVar271._28_4_ = 0xff800000;
              auVar88 = vblendmps_avx512vl(auVar255,auVar271);
              bVar58 = (byte)uVar51;
              uVar62 = (uint)(bVar58 & 1) * auVar88._0_4_ |
                       (uint)!(bool)(bVar58 & 1) * auVar90._0_4_;
              bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
              uVar136 = (uint)bVar60 * auVar88._4_4_ | (uint)!bVar60 * auVar90._4_4_;
              bVar60 = (bool)((byte)(uVar51 >> 2) & 1);
              uVar137 = (uint)bVar60 * auVar88._8_4_ | (uint)!bVar60 * auVar90._8_4_;
              bVar60 = (bool)((byte)(uVar51 >> 3) & 1);
              uVar138 = (uint)bVar60 * auVar88._12_4_ | (uint)!bVar60 * auVar90._12_4_;
              bVar60 = (bool)((byte)(uVar51 >> 4) & 1);
              uVar139 = (uint)bVar60 * auVar88._16_4_ | (uint)!bVar60 * auVar90._16_4_;
              bVar60 = (bool)((byte)(uVar51 >> 5) & 1);
              uVar140 = (uint)bVar60 * auVar88._20_4_ | (uint)!bVar60 * auVar90._20_4_;
              bVar60 = (bool)((byte)(uVar51 >> 6) & 1);
              uVar141 = (uint)bVar60 * auVar88._24_4_ | (uint)!bVar60 * auVar90._24_4_;
              bVar60 = SUB81(uVar51 >> 7,0);
              uVar142 = (uint)bVar60 * auVar88._28_4_ | (uint)!bVar60 * auVar90._28_4_;
              auVar112._0_4_ = (bVar52 & 1) * uVar62 | !(bool)(bVar52 & 1) * auVar112._0_4_;
              bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
              auVar112._4_4_ = bVar60 * uVar136 | !bVar60 * auVar112._4_4_;
              bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
              auVar112._8_4_ = bVar60 * uVar137 | !bVar60 * auVar112._8_4_;
              bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
              auVar112._12_4_ = bVar60 * uVar138 | !bVar60 * auVar112._12_4_;
              bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
              auVar112._16_4_ = bVar60 * uVar139 | !bVar60 * auVar112._16_4_;
              bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
              auVar112._20_4_ = bVar60 * uVar140 | !bVar60 * auVar112._20_4_;
              bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
              auVar112._24_4_ = bVar60 * uVar141 | !bVar60 * auVar112._24_4_;
              bVar60 = SUB81(uVar61 >> 7,0);
              auVar112._28_4_ = bVar60 * uVar142 | !bVar60 * auVar112._28_4_;
              auVar88 = vblendmps_avx512vl(auVar271,auVar255);
              bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar51 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar51 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar51 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar51 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar51 >> 6) & 1);
              bVar10 = SUB81(uVar51 >> 7,0);
              auVar125._0_4_ =
                   (uint)(bVar52 & 1) *
                   ((uint)(bVar58 & 1) * auVar88._0_4_ | !(bool)(bVar58 & 1) * uVar62) |
                   !(bool)(bVar52 & 1) * auVar125._0_4_;
              bVar4 = (bool)((byte)(uVar61 >> 1) & 1);
              auVar125._4_4_ =
                   (uint)bVar4 * ((uint)bVar60 * auVar88._4_4_ | !bVar60 * uVar136) |
                   !bVar4 * auVar125._4_4_;
              bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
              auVar125._8_4_ =
                   (uint)bVar60 * ((uint)bVar5 * auVar88._8_4_ | !bVar5 * uVar137) |
                   !bVar60 * auVar125._8_4_;
              bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
              auVar125._12_4_ =
                   (uint)bVar60 * ((uint)bVar6 * auVar88._12_4_ | !bVar6 * uVar138) |
                   !bVar60 * auVar125._12_4_;
              bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
              auVar125._16_4_ =
                   (uint)bVar60 * ((uint)bVar7 * auVar88._16_4_ | !bVar7 * uVar139) |
                   !bVar60 * auVar125._16_4_;
              bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
              auVar125._20_4_ =
                   (uint)bVar60 * ((uint)bVar8 * auVar88._20_4_ | !bVar8 * uVar140) |
                   !bVar60 * auVar125._20_4_;
              bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
              auVar125._24_4_ =
                   (uint)bVar60 * ((uint)bVar9 * auVar88._24_4_ | !bVar9 * uVar141) |
                   !bVar60 * auVar125._24_4_;
              bVar60 = SUB81(uVar61 >> 7,0);
              auVar125._28_4_ =
                   (uint)bVar60 * ((uint)bVar10 * auVar88._28_4_ | !bVar10 * uVar142) |
                   !bVar60 * auVar125._28_4_;
              bVar55 = (~bVar52 | bVar58) & bVar55;
            }
          }
          auVar267._0_4_ = local_600._0_4_ * auVar256._0_4_;
          auVar267._4_4_ = local_600._4_4_ * auVar256._4_4_;
          auVar267._8_4_ = local_600._8_4_ * auVar256._8_4_;
          auVar267._12_4_ = local_600._12_4_ * auVar256._12_4_;
          auVar267._16_4_ = local_600._16_4_ * auVar256._16_4_;
          auVar267._20_4_ = local_600._20_4_ * auVar256._20_4_;
          auVar267._28_36_ = auVar256._28_36_;
          auVar267._24_4_ = local_600._24_4_ * auVar256._24_4_;
          auVar260 = ZEXT3264(local_5e0);
          auVar68 = vfmadd231ps_fma(auVar267._0_32_,local_5e0,auVar89);
          auVar256 = ZEXT3264(_local_5c0);
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),_local_5c0,auVar94);
          auVar246._8_4_ = 0x7fffffff;
          auVar246._0_8_ = 0x7fffffff7fffffff;
          auVar246._12_4_ = 0x7fffffff;
          auVar246._16_4_ = 0x7fffffff;
          auVar246._20_4_ = 0x7fffffff;
          auVar246._24_4_ = 0x7fffffff;
          auVar246._28_4_ = 0x7fffffff;
          auVar88 = vandps_avx(ZEXT1632(auVar68),auVar246);
          auVar267 = ZEXT3264(_local_820);
          _local_1c0 = _local_820;
          auVar240._8_4_ = 0x3e99999a;
          auVar240._0_8_ = 0x3e99999a3e99999a;
          auVar240._12_4_ = 0x3e99999a;
          auVar240._16_4_ = 0x3e99999a;
          auVar240._20_4_ = 0x3e99999a;
          auVar240._24_4_ = 0x3e99999a;
          auVar240._28_4_ = 0x3e99999a;
          uVar12 = vcmpps_avx512vl(auVar88,auVar240,1);
          local_5a0._0_2_ = (short)uVar12;
          local_3a0 = vmaxps_avx(_local_820,auVar125);
          auVar88 = vminps_avx(local_380,auVar112);
          uVar12 = vcmpps_avx512vl(_local_820,auVar88,2);
          bVar52 = (byte)uVar12 & bVar48;
          uVar13 = vcmpps_avx512vl(local_3a0,local_380,2);
          if ((bVar48 & ((byte)uVar13 | (byte)uVar12)) != 0) {
            auVar41._4_4_ = local_600._4_4_ * auVar264._4_4_;
            auVar41._0_4_ = local_600._0_4_ * auVar264._0_4_;
            auVar41._8_4_ = local_600._8_4_ * auVar264._8_4_;
            auVar41._12_4_ = local_600._12_4_ * auVar264._12_4_;
            auVar41._16_4_ = local_600._16_4_ * auVar264._16_4_;
            auVar41._20_4_ = local_600._20_4_ * auVar264._20_4_;
            auVar41._24_4_ = local_600._24_4_ * auVar264._24_4_;
            auVar41._28_4_ = auVar88._28_4_;
            auVar68 = vfmadd213ps_fma(auVar104,local_5e0,auVar41);
            auVar68 = vfmadd213ps_fma(auVar87,_local_5c0,ZEXT1632(auVar68));
            auVar87 = vandps_avx(ZEXT1632(auVar68),auVar246);
            uVar12 = vcmpps_avx512vl(auVar87,auVar240,1);
            bVar58 = (byte)uVar12 | ~bVar55;
            auVar156._8_4_ = 2;
            auVar156._0_8_ = 0x200000002;
            auVar156._12_4_ = 2;
            auVar156._16_4_ = 2;
            auVar156._20_4_ = 2;
            auVar156._24_4_ = 2;
            auVar156._28_4_ = 2;
            auVar27._8_4_ = 3;
            auVar27._0_8_ = 0x300000003;
            auVar27._12_4_ = 3;
            auVar27._16_4_ = 3;
            auVar27._20_4_ = 3;
            auVar27._24_4_ = 3;
            auVar27._28_4_ = 3;
            auVar87 = vpblendmd_avx512vl(auVar156,auVar27);
            local_340._0_4_ = (uint)(bVar58 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
            bVar60 = (bool)(bVar58 >> 1 & 1);
            local_340._4_4_ = (uint)bVar60 * auVar87._4_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar58 >> 2 & 1);
            local_340._8_4_ = (uint)bVar60 * auVar87._8_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar58 >> 3 & 1);
            local_340._12_4_ = (uint)bVar60 * auVar87._12_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar58 >> 4 & 1);
            local_340._16_4_ = (uint)bVar60 * auVar87._16_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar58 >> 5 & 1);
            local_340._20_4_ = (uint)bVar60 * auVar87._20_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar58 >> 6 & 1);
            local_340._24_4_ = (uint)bVar60 * auVar87._24_4_ | (uint)!bVar60 * 2;
            local_340._28_4_ = (uint)(bVar58 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2
            ;
            local_520 = vpbroadcastd_avx512vl();
            uVar12 = vpcmpd_avx512vl(local_520,local_340,5);
            bVar58 = (byte)uVar12 & bVar52;
            auVar129._16_16_ = auVar86._16_16_;
            if (bVar58 == 0) {
              auVar158._4_4_ = uVar63;
              auVar158._0_4_ = uVar63;
              auVar158._8_4_ = uVar63;
              auVar158._12_4_ = uVar63;
              auVar158._16_4_ = uVar63;
              auVar158._20_4_ = uVar63;
              auVar158._24_4_ = uVar63;
              auVar158._28_4_ = uVar63;
              auVar87 = local_3a0;
            }
            else {
              local_360 = local_3a0;
              auVar70 = vminps_avx(local_740._0_16_,local_780._0_16_);
              auVar68 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
              auVar76 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar69 = vminps_avx(auVar70,auVar76);
              auVar70 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar76 = vmaxps_avx(auVar68,auVar70);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx(auVar69,auVar183);
              auVar70 = vandps_avx(auVar76,auVar183);
              auVar68 = vmaxps_avx(auVar68,auVar70);
              auVar70 = vmovshdup_avx(auVar68);
              auVar70 = vmaxss_avx(auVar70,auVar68);
              auVar68 = vshufpd_avx(auVar68,auVar68,1);
              auVar68 = vmaxss_avx(auVar68,auVar70);
              fVar228 = auVar68._0_4_ * 1.9073486e-06;
              local_6c0 = vshufps_avx(auVar76,auVar76,0xff);
              local_580 = (float)local_820._0_4_ + fVar161;
              fStack_57c = (float)local_820._4_4_ + fVar161;
              fStack_578 = fStack_818 + fVar161;
              fStack_574 = fStack_814 + fVar161;
              fStack_570 = fStack_810 + fVar161;
              fStack_56c = fStack_80c + fVar161;
              fStack_568 = fStack_808 + fVar161;
              fStack_564 = fStack_804 + fVar161;
              do {
                auVar157._8_4_ = 0x7f800000;
                auVar157._0_8_ = 0x7f8000007f800000;
                auVar157._12_4_ = 0x7f800000;
                auVar157._16_4_ = 0x7f800000;
                auVar157._20_4_ = 0x7f800000;
                auVar157._24_4_ = 0x7f800000;
                auVar157._28_4_ = 0x7f800000;
                auVar87 = vblendmps_avx512vl(auVar157,_local_820);
                auVar127._0_4_ =
                     (uint)(bVar58 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
                bVar60 = (bool)(bVar58 >> 1 & 1);
                auVar127._4_4_ = (uint)bVar60 * auVar87._4_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar58 >> 2 & 1);
                auVar127._8_4_ = (uint)bVar60 * auVar87._8_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar58 >> 3 & 1);
                auVar127._12_4_ = (uint)bVar60 * auVar87._12_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar58 >> 4 & 1);
                auVar127._16_4_ = (uint)bVar60 * auVar87._16_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar58 >> 5 & 1);
                auVar127._20_4_ = (uint)bVar60 * auVar87._20_4_ | (uint)!bVar60 * 0x7f800000;
                auVar127._24_4_ =
                     (uint)(bVar58 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
                auVar127._28_4_ = 0x7f800000;
                auVar87 = vshufps_avx(auVar127,auVar127,0xb1);
                auVar87 = vminps_avx(auVar127,auVar87);
                auVar88 = vshufpd_avx(auVar87,auVar87,5);
                auVar87 = vminps_avx(auVar87,auVar88);
                auVar88 = vpermpd_avx2(auVar87,0x4e);
                auVar87 = vminps_avx(auVar87,auVar88);
                uVar12 = vcmpps_avx512vl(auVar127,auVar87,0);
                bVar49 = (byte)uVar12 & bVar58;
                bVar50 = bVar58;
                if (bVar49 != 0) {
                  bVar50 = bVar49;
                }
                iVar15 = 0;
                for (uVar63 = (uint)bVar50; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                  iVar15 = iVar15 + 1;
                }
                uVar63 = *(uint *)(local_1e0 + (uint)(iVar15 << 2));
                uVar62 = *(uint *)(local_1c0 + (uint)(iVar15 << 2));
                fVar205 = auVar65._0_4_;
                if ((float)local_7c0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_7c0._0_4_);
                }
                auVar68 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar63),0x10);
                bVar60 = true;
                uVar61 = 0;
                do {
                  uVar162 = auVar68._0_4_;
                  auVar145._4_4_ = uVar162;
                  auVar145._0_4_ = uVar162;
                  auVar145._8_4_ = uVar162;
                  auVar145._12_4_ = uVar162;
                  auVar70 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_7b0);
                  auVar76 = vmovshdup_avx(auVar68);
                  fVar248 = auVar76._0_4_;
                  fVar227 = 1.0 - fVar248;
                  fVar222 = fVar248 * fVar248;
                  auVar73 = SUB6416(ZEXT464(0x40400000),0);
                  auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar266 = vfmadd213ss_fma(auVar73,auVar76,auVar72);
                  auVar69 = vfmadd213ss_fma(auVar266,ZEXT416((uint)fVar222),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar71 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar227),auVar72);
                  auVar71 = vfmadd213ss_fma(auVar71,ZEXT416((uint)(fVar227 * fVar227)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar223 = fVar227 * fVar227 * -fVar248 * 0.5;
                  fVar224 = auVar69._0_4_ * 0.5;
                  fVar225 = auVar71._0_4_ * 0.5;
                  fVar226 = fVar248 * fVar248 * -fVar227 * 0.5;
                  auVar208._0_4_ = fVar226 * (float)local_7a0._0_4_;
                  auVar208._4_4_ = fVar226 * (float)local_7a0._4_4_;
                  auVar208._8_4_ = fVar226 * fStack_798;
                  auVar208._12_4_ = fVar226 * fStack_794;
                  auVar231._4_4_ = fVar225;
                  auVar231._0_4_ = fVar225;
                  auVar231._8_4_ = fVar225;
                  auVar231._12_4_ = fVar225;
                  auVar69 = vfmadd132ps_fma(auVar231,auVar208,local_760._0_16_);
                  auVar184._4_4_ = fVar224;
                  auVar184._0_4_ = fVar224;
                  auVar184._8_4_ = fVar224;
                  auVar184._12_4_ = fVar224;
                  auVar69 = vfmadd132ps_fma(auVar184,auVar69,local_780._0_16_);
                  auVar209._4_4_ = fVar223;
                  auVar209._0_4_ = fVar223;
                  auVar209._8_4_ = fVar223;
                  auVar209._12_4_ = fVar223;
                  auVar69 = vfmadd132ps_fma(auVar209,auVar69,local_740._0_16_);
                  auVar71 = vfmadd231ss_fma(auVar72,auVar76,ZEXT416(0x41100000));
                  local_640._0_16_ = auVar71;
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,
                                            ZEXT416(0x40800000));
                  local_660._0_16_ = auVar71;
                  auVar71 = vfmadd213ss_fma(auVar73,auVar76,ZEXT416(0xbf800000));
                  local_680._0_16_ = auVar71;
                  _local_620 = auVar69;
                  auVar69 = vsubps_avx(auVar70,auVar69);
                  auVar70 = vdpps_avx(auVar69,auVar69,0x7f);
                  fVar223 = auVar70._0_4_;
                  local_720 = ZEXT1632(auVar68);
                  if (fVar223 < 0.0) {
                    local_7e0._0_4_ = fVar222;
                    local_800._0_4_ = fVar227 * -2.0;
                    auVar260._0_4_ = sqrtf(fVar223);
                    auVar260._4_60_ = extraout_var;
                    auVar266 = ZEXT416(auVar266._0_4_);
                    auVar68 = auVar260._0_16_;
                  }
                  else {
                    auVar68 = vsqrtss_avx(auVar70,auVar70);
                    local_800._0_4_ = fVar227 * -2.0;
                    local_7e0._0_4_ = fVar222;
                  }
                  auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar227 + fVar227))),
                                             ZEXT416((uint)fVar227),ZEXT416((uint)fVar227));
                  auVar266 = vfmadd213ss_fma(auVar266,ZEXT416((uint)(fVar248 + fVar248)),
                                             ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                            ZEXT416((uint)(fVar227 + fVar227)),auVar71);
                  auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_800._0_4_),auVar76,
                                            ZEXT416((uint)local_7e0._0_4_));
                  fVar222 = auVar73._0_4_ * 0.5;
                  fVar224 = auVar266._0_4_ * 0.5;
                  fVar225 = auVar72._0_4_ * 0.5;
                  fVar226 = auVar71._0_4_ * 0.5;
                  auVar210._0_4_ = fVar226 * (float)local_7a0._0_4_;
                  auVar210._4_4_ = fVar226 * (float)local_7a0._4_4_;
                  auVar210._8_4_ = fVar226 * fStack_798;
                  auVar210._12_4_ = fVar226 * fStack_794;
                  auVar185._4_4_ = fVar225;
                  auVar185._0_4_ = fVar225;
                  auVar185._8_4_ = fVar225;
                  auVar185._12_4_ = fVar225;
                  auVar266 = vfmadd132ps_fma(auVar185,auVar210,local_760._0_16_);
                  auVar166._4_4_ = fVar224;
                  auVar166._0_4_ = fVar224;
                  auVar166._8_4_ = fVar224;
                  auVar166._12_4_ = fVar224;
                  auVar266 = vfmadd132ps_fma(auVar166,auVar266,local_780._0_16_);
                  auVar269._4_4_ = fVar222;
                  auVar269._0_4_ = fVar222;
                  auVar269._8_4_ = fVar222;
                  auVar269._12_4_ = fVar222;
                  auVar266 = vfmadd132ps_fma(auVar269,auVar266,local_740._0_16_);
                  local_7e0._0_16_ = vdpps_avx(auVar266,auVar266,0x7f);
                  auVar43._12_4_ = 0;
                  auVar43._0_12_ = ZEXT812(0);
                  fVar222 = local_7e0._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar222));
                  fVar224 = auVar71._0_4_;
                  local_800._0_16_ = vrcp14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar222));
                  auVar17._8_4_ = 0x80000000;
                  auVar17._0_8_ = 0x8000000080000000;
                  auVar17._12_4_ = 0x80000000;
                  auVar72 = vxorps_avx512vl(local_7e0._0_16_,auVar17);
                  auVar71 = vfnmadd213ss_fma(local_800._0_16_,local_7e0._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar63 = auVar68._0_4_;
                  if (fVar222 < auVar72._0_4_) {
                    fVar225 = sqrtf(fVar222);
                    auVar68 = ZEXT416(uVar63);
                  }
                  else {
                    auVar72 = vsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                    fVar225 = auVar72._0_4_;
                  }
                  fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
                  auVar146._0_4_ = auVar266._0_4_ * fVar222;
                  auVar146._4_4_ = auVar266._4_4_ * fVar222;
                  auVar146._8_4_ = auVar266._8_4_ * fVar222;
                  auVar146._12_4_ = auVar266._12_4_ * fVar222;
                  auVar72 = vdpps_avx(auVar69,auVar146,0x7f);
                  fVar227 = auVar68._0_4_;
                  fVar224 = auVar72._0_4_;
                  auVar147._0_4_ = fVar224 * fVar224;
                  auVar147._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                  auVar147._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                  auVar147._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                  auVar73 = vsubps_avx512vl(auVar70,auVar147);
                  fVar226 = auVar73._0_4_;
                  auVar167._4_12_ = ZEXT812(0) << 0x20;
                  auVar167._0_4_ = fVar226;
                  auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
                  auVar74 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
                  if (fVar226 < 0.0) {
                    local_6b0 = fVar222;
                    fStack_6ac = fVar222;
                    fStack_6a8 = fVar222;
                    fStack_6a4 = fVar222;
                    local_6a0 = auVar66;
                    fVar226 = sqrtf(fVar226);
                    auVar74 = ZEXT416(auVar74._0_4_);
                    auVar68 = ZEXT416(uVar63);
                    auVar73 = local_6a0;
                    fVar222 = local_6b0;
                    fVar248 = fStack_6ac;
                    fVar249 = fStack_6a8;
                    fVar250 = fStack_6a4;
                  }
                  else {
                    auVar73 = vsqrtss_avx(auVar73,auVar73);
                    fVar226 = auVar73._0_4_;
                    auVar73 = auVar66;
                    fVar248 = fVar222;
                    fVar249 = fVar222;
                    fVar250 = fVar222;
                  }
                  auVar264 = ZEXT1664(auVar69);
                  auVar168._0_4_ = (float)local_680._0_4_ * (float)local_7a0._0_4_;
                  auVar168._4_4_ = (float)local_680._0_4_ * (float)local_7a0._4_4_;
                  auVar168._8_4_ = (float)local_680._0_4_ * fStack_798;
                  auVar168._12_4_ = (float)local_680._0_4_ * fStack_794;
                  auVar186._4_4_ = local_660._0_4_;
                  auVar186._0_4_ = local_660._0_4_;
                  auVar186._8_4_ = local_660._0_4_;
                  auVar186._12_4_ = local_660._0_4_;
                  auVar64 = vfmadd132ps_fma(auVar186,auVar168,local_760._0_16_);
                  auVar169._4_4_ = local_640._0_4_;
                  auVar169._0_4_ = local_640._0_4_;
                  auVar169._8_4_ = local_640._0_4_;
                  auVar169._12_4_ = local_640._0_4_;
                  auVar64 = vfmadd132ps_fma(auVar169,auVar64,local_780._0_16_);
                  auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar76._0_4_;
                  auVar187._4_4_ = uVar162;
                  auVar187._0_4_ = uVar162;
                  auVar187._8_4_ = uVar162;
                  auVar187._12_4_ = uVar162;
                  auVar76 = vfmadd132ps_fma(auVar187,auVar64,local_740._0_16_);
                  auVar170._0_4_ = auVar76._0_4_ * (float)local_7e0._0_4_;
                  auVar170._4_4_ = auVar76._4_4_ * (float)local_7e0._0_4_;
                  auVar170._8_4_ = auVar76._8_4_ * (float)local_7e0._0_4_;
                  auVar170._12_4_ = auVar76._12_4_ * (float)local_7e0._0_4_;
                  auVar76 = vdpps_avx(auVar266,auVar76,0x7f);
                  fVar180 = auVar76._0_4_;
                  auVar188._0_4_ = auVar266._0_4_ * fVar180;
                  auVar188._4_4_ = auVar266._4_4_ * fVar180;
                  auVar188._8_4_ = auVar266._8_4_ * fVar180;
                  auVar188._12_4_ = auVar266._12_4_ * fVar180;
                  auVar76 = vsubps_avx(auVar170,auVar188);
                  fVar180 = auVar71._0_4_ * (float)local_800._0_4_;
                  auVar64 = vmaxss_avx(ZEXT416((uint)fVar228),
                                       ZEXT416((uint)(local_720._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar18._8_4_ = 0x80000000;
                  auVar18._0_8_ = 0x8000000080000000;
                  auVar18._12_4_ = 0x80000000;
                  auVar75 = vxorps_avx512vl(auVar266,auVar18);
                  auVar189._0_4_ = fVar222 * auVar76._0_4_ * fVar180;
                  auVar189._4_4_ = fVar248 * auVar76._4_4_ * fVar180;
                  auVar189._8_4_ = fVar249 * auVar76._8_4_ * fVar180;
                  auVar189._12_4_ = fVar250 * auVar76._12_4_ * fVar180;
                  auVar267 = ZEXT1664(auVar146);
                  auVar76 = vdpps_avx(auVar75,auVar146,0x7f);
                  auVar71 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar228),auVar64);
                  auVar68 = vdpps_avx(auVar69,auVar189,0x7f);
                  auVar143 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                             ZEXT416((uint)(fVar228 / fVar225)),auVar71);
                  fVar222 = auVar76._0_4_ + auVar68._0_4_;
                  auVar68 = vdpps_avx(local_7b0,auVar146,0x7f);
                  auVar76 = vdpps_avx(auVar69,auVar75,0x7f);
                  auVar71 = vmulss_avx512f(auVar74,auVar73);
                  fVar225 = auVar66._0_4_ * 1.5 + auVar71._0_4_ * auVar73._0_4_ * auVar73._0_4_;
                  auVar71 = vdpps_avx(auVar69,local_7b0,0x7f);
                  auVar66 = vfnmadd231ss_fma(auVar76,auVar72,ZEXT416((uint)fVar222));
                  auVar71 = vfnmadd231ss_fma(auVar71,auVar72,auVar68);
                  auVar76 = vpermilps_avx(_local_620,0xff);
                  fVar226 = fVar226 - auVar76._0_4_;
                  auVar73 = vshufps_avx(auVar266,auVar266,0xff);
                  auVar76 = vfmsub213ss_fma(auVar66,ZEXT416((uint)fVar225),auVar73);
                  auVar258._8_4_ = 0x80000000;
                  auVar258._0_8_ = 0x8000000080000000;
                  auVar258._12_4_ = 0x80000000;
                  auVar260 = ZEXT1664(auVar258);
                  auVar253._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar253._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar253._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar256 = ZEXT1664(auVar253);
                  auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar225));
                  auVar66 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar76._0_4_)),
                                            ZEXT416((uint)fVar222),auVar71);
                  auVar76 = vinsertps_avx(auVar253,auVar71,0x1c);
                  auVar238._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
                  auVar238._8_4_ = auVar68._8_4_ ^ 0x80000000;
                  auVar238._12_4_ = auVar68._12_4_ ^ 0x80000000;
                  auVar71 = vinsertps_avx(ZEXT416((uint)fVar222),auVar238,0x10);
                  auVar211._0_4_ = auVar66._0_4_;
                  auVar211._4_4_ = auVar211._0_4_;
                  auVar211._8_4_ = auVar211._0_4_;
                  auVar211._12_4_ = auVar211._0_4_;
                  auVar68 = vdivps_avx(auVar76,auVar211);
                  auVar76 = vdivps_avx(auVar71,auVar211);
                  auVar212._0_4_ = fVar224 * auVar68._0_4_ + fVar226 * auVar76._0_4_;
                  auVar212._4_4_ = fVar224 * auVar68._4_4_ + fVar226 * auVar76._4_4_;
                  auVar212._8_4_ = fVar224 * auVar68._8_4_ + fVar226 * auVar76._8_4_;
                  auVar212._12_4_ = fVar224 * auVar68._12_4_ + fVar226 * auVar76._12_4_;
                  auVar68 = vsubps_avx(local_720._0_16_,auVar212);
                  auVar19._8_4_ = 0x7fffffff;
                  auVar19._0_8_ = 0x7fffffff7fffffff;
                  auVar19._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(auVar72,auVar19);
                  if (auVar76._0_4_ < auVar143._0_4_) {
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar143._0_4_ + auVar64._0_4_)),
                                              local_6c0,ZEXT416(0x36000000));
                    auVar20._8_4_ = 0x7fffffff;
                    auVar20._0_8_ = 0x7fffffff7fffffff;
                    auVar20._12_4_ = 0x7fffffff;
                    auVar71 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar20);
                    if (auVar71._0_4_ < auVar76._0_4_) {
                      fVar205 = auVar68._0_4_ + (float)local_6d0._0_4_;
                      if (fVar205 < fVar160) {
LAB_01ac5c12:
                        bVar50 = 0;
                        goto LAB_01ac5c3a;
                      }
                      fVar222 = *(float *)(ray + k * 4 + 0x100);
                      if (fVar205 <= fVar222) {
                        auVar76 = vmovshdup_avx(auVar68);
                        bVar50 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01ac5c3a;
                        auVar213._0_12_ = ZEXT812(0);
                        auVar213._12_4_ = 0;
                        auVar129._0_16_ = auVar213;
                        auVar128._4_28_ = auVar129._4_28_;
                        auVar128._0_4_ = fVar223;
                        auVar76 = vrsqrt14ss_avx512f(auVar213,auVar128._0_16_);
                        fVar223 = auVar76._0_4_;
                        auVar70 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
                        pGVar2 = (context->scene->geometries).items[uVar59].ptr;
                        if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01ac5c12;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar50 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ac5c3a;
                        fVar223 = fVar223 * 1.5 + auVar70._0_4_ * fVar223 * fVar223 * fVar223;
                        auVar190._0_4_ = auVar69._0_4_ * fVar223;
                        auVar190._4_4_ = auVar69._4_4_ * fVar223;
                        auVar190._8_4_ = auVar69._8_4_ * fVar223;
                        auVar190._12_4_ = auVar69._12_4_ * fVar223;
                        auVar71 = vfmadd213ps_fma(auVar73,auVar190,auVar266);
                        auVar70 = vshufps_avx(auVar190,auVar190,0xc9);
                        auVar76 = vshufps_avx(auVar266,auVar266,0xc9);
                        auVar191._0_4_ = auVar190._0_4_ * auVar76._0_4_;
                        auVar191._4_4_ = auVar190._4_4_ * auVar76._4_4_;
                        auVar191._8_4_ = auVar190._8_4_ * auVar76._8_4_;
                        auVar191._12_4_ = auVar190._12_4_ * auVar76._12_4_;
                        auVar266 = vfmsub231ps_fma(auVar191,auVar266,auVar70);
                        auVar70 = vshufps_avx(auVar266,auVar266,0xc9);
                        auVar76 = vshufps_avx(auVar71,auVar71,0xc9);
                        auVar266 = vshufps_avx(auVar266,auVar266,0xd2);
                        auVar148._0_4_ = auVar71._0_4_ * auVar266._0_4_;
                        auVar148._4_4_ = auVar71._4_4_ * auVar266._4_4_;
                        auVar148._8_4_ = auVar71._8_4_ * auVar266._8_4_;
                        auVar148._12_4_ = auVar71._12_4_ * auVar266._12_4_;
                        auVar70 = vfmsub231ps_fma(auVar148,auVar70,auVar76);
                        auVar220._8_4_ = 1;
                        auVar220._0_8_ = 0x100000001;
                        auVar220._12_4_ = 1;
                        auVar220._16_4_ = 1;
                        auVar220._20_4_ = 1;
                        auVar220._24_4_ = 1;
                        auVar220._28_4_ = 1;
                        local_460 = vpermps_avx2(auVar220,ZEXT1632(auVar68));
                        auVar87 = vpermps_avx2(auVar220,ZEXT1632(auVar70));
                        auVar234._8_4_ = 2;
                        auVar234._0_8_ = 0x200000002;
                        auVar234._12_4_ = 2;
                        auVar234._16_4_ = 2;
                        auVar234._20_4_ = 2;
                        auVar234._24_4_ = 2;
                        auVar234._28_4_ = 2;
                        local_4a0 = vpermps_avx2(auVar234,ZEXT1632(auVar70));
                        local_480 = auVar70._0_4_;
                        local_4c0[0] = (RTCHitN)auVar87[0];
                        local_4c0[1] = (RTCHitN)auVar87[1];
                        local_4c0[2] = (RTCHitN)auVar87[2];
                        local_4c0[3] = (RTCHitN)auVar87[3];
                        local_4c0[4] = (RTCHitN)auVar87[4];
                        local_4c0[5] = (RTCHitN)auVar87[5];
                        local_4c0[6] = (RTCHitN)auVar87[6];
                        local_4c0[7] = (RTCHitN)auVar87[7];
                        local_4c0[8] = (RTCHitN)auVar87[8];
                        local_4c0[9] = (RTCHitN)auVar87[9];
                        local_4c0[10] = (RTCHitN)auVar87[10];
                        local_4c0[0xb] = (RTCHitN)auVar87[0xb];
                        local_4c0[0xc] = (RTCHitN)auVar87[0xc];
                        local_4c0[0xd] = (RTCHitN)auVar87[0xd];
                        local_4c0[0xe] = (RTCHitN)auVar87[0xe];
                        local_4c0[0xf] = (RTCHitN)auVar87[0xf];
                        local_4c0[0x10] = (RTCHitN)auVar87[0x10];
                        local_4c0[0x11] = (RTCHitN)auVar87[0x11];
                        local_4c0[0x12] = (RTCHitN)auVar87[0x12];
                        local_4c0[0x13] = (RTCHitN)auVar87[0x13];
                        local_4c0[0x14] = (RTCHitN)auVar87[0x14];
                        local_4c0[0x15] = (RTCHitN)auVar87[0x15];
                        local_4c0[0x16] = (RTCHitN)auVar87[0x16];
                        local_4c0[0x17] = (RTCHitN)auVar87[0x17];
                        local_4c0[0x18] = (RTCHitN)auVar87[0x18];
                        local_4c0[0x19] = (RTCHitN)auVar87[0x19];
                        local_4c0[0x1a] = (RTCHitN)auVar87[0x1a];
                        local_4c0[0x1b] = (RTCHitN)auVar87[0x1b];
                        local_4c0[0x1c] = (RTCHitN)auVar87[0x1c];
                        local_4c0[0x1d] = (RTCHitN)auVar87[0x1d];
                        local_4c0[0x1e] = (RTCHitN)auVar87[0x1e];
                        local_4c0[0x1f] = (RTCHitN)auVar87[0x1f];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        local_440 = ZEXT432(0) << 0x20;
                        local_420 = local_4e0._0_8_;
                        uStack_418 = local_4e0._8_8_;
                        uStack_410 = local_4e0._16_8_;
                        uStack_408 = local_4e0._24_8_;
                        local_400 = local_500;
                        vpcmpeqd_avx2(local_500,local_500);
                        local_3e0 = context->user->instID[0];
                        uStack_3dc = local_3e0;
                        uStack_3d8 = local_3e0;
                        uStack_3d4 = local_3e0;
                        uStack_3d0 = local_3e0;
                        uStack_3cc = local_3e0;
                        uStack_3c8 = local_3e0;
                        uStack_3c4 = local_3e0;
                        local_3c0 = context->user->instPrimID[0];
                        uStack_3bc = local_3c0;
                        uStack_3b8 = local_3c0;
                        uStack_3b4 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3ac = local_3c0;
                        uStack_3a8 = local_3c0;
                        uStack_3a4 = local_3c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar205;
                        local_700 = local_540;
                        local_850.valid = (int *)local_700;
                        local_850.geometryUserPtr = pGVar2->userPtr;
                        local_850.context = context->user;
                        local_850.hit = local_4c0;
                        local_850.N = 8;
                        local_850.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar256 = ZEXT1664(auVar253);
                          auVar260 = ZEXT1664(auVar258);
                          auVar264 = ZEXT1664(auVar69);
                          auVar267 = ZEXT1664(auVar146);
                          (*pGVar2->occlusionFilterN)(&local_850);
                        }
                        if (local_700 != (undefined1  [32])0x0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar256 = ZEXT1664(auVar256._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            (*p_Var3)(&local_850);
                          }
                          uVar61 = vptestmd_avx512vl(local_700,local_700);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar61 & 1);
                          bVar5 = (bool)((byte)(uVar61 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar61 >> 2) & 1);
                          bVar7 = (bool)((byte)(uVar61 >> 3) & 1);
                          bVar8 = (bool)((byte)(uVar61 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar61 >> 5) & 1);
                          bVar10 = (bool)((byte)(uVar61 >> 6) & 1);
                          bVar11 = SUB81(uVar61 >> 7,0);
                          *(uint *)(local_850.ray + 0x100) =
                               (uint)bVar4 * auVar87._0_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x100);
                          *(uint *)(local_850.ray + 0x104) =
                               (uint)bVar5 * auVar87._4_4_ |
                               (uint)!bVar5 * *(int *)(local_850.ray + 0x104);
                          *(uint *)(local_850.ray + 0x108) =
                               (uint)bVar6 * auVar87._8_4_ |
                               (uint)!bVar6 * *(int *)(local_850.ray + 0x108);
                          *(uint *)(local_850.ray + 0x10c) =
                               (uint)bVar7 * auVar87._12_4_ |
                               (uint)!bVar7 * *(int *)(local_850.ray + 0x10c);
                          *(uint *)(local_850.ray + 0x110) =
                               (uint)bVar8 * auVar87._16_4_ |
                               (uint)!bVar8 * *(int *)(local_850.ray + 0x110);
                          *(uint *)(local_850.ray + 0x114) =
                               (uint)bVar9 * auVar87._20_4_ |
                               (uint)!bVar9 * *(int *)(local_850.ray + 0x114);
                          *(uint *)(local_850.ray + 0x118) =
                               (uint)bVar10 * auVar87._24_4_ |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x118);
                          *(uint *)(local_850.ray + 0x11c) =
                               (uint)bVar11 * auVar87._28_4_ |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x11c);
                          bVar50 = 1;
                          if (local_700 != (undefined1  [32])0x0) goto LAB_01ac5c3a;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar222;
                      }
                      bVar50 = 0;
                      goto LAB_01ac5c3a;
                    }
                  }
                  bVar60 = uVar61 < 4;
                  uVar61 = uVar61 + 1;
                } while (uVar61 != 5);
                bVar60 = false;
                bVar50 = 5;
LAB_01ac5c3a:
                bVar57 = (bool)(bVar57 | bVar60 & bVar50);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar158._4_4_ = uVar162;
                auVar158._0_4_ = uVar162;
                auVar158._8_4_ = uVar162;
                auVar158._12_4_ = uVar162;
                auVar158._16_4_ = uVar162;
                auVar158._20_4_ = uVar162;
                auVar158._24_4_ = uVar162;
                auVar158._28_4_ = uVar162;
                auVar45._4_4_ = fStack_57c;
                auVar45._0_4_ = local_580;
                auVar45._8_4_ = fStack_578;
                auVar45._12_4_ = fStack_574;
                auVar45._16_4_ = fStack_570;
                auVar45._20_4_ = fStack_56c;
                auVar45._24_4_ = fStack_568;
                auVar45._28_4_ = fStack_564;
                uVar12 = vcmpps_avx512vl(auVar158,auVar45,0xd);
                bVar58 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar58 & (byte)uVar12;
                auVar87 = local_360;
              } while (bVar58 != 0);
            }
            auVar247 = ZEXT3264(local_3a0);
            bVar55 = local_5a0[0] | ~bVar55;
            auVar178._0_4_ = fVar161 + auVar87._0_4_;
            auVar178._4_4_ = fVar161 + auVar87._4_4_;
            auVar178._8_4_ = fVar161 + auVar87._8_4_;
            auVar178._12_4_ = fVar161 + auVar87._12_4_;
            auVar178._16_4_ = fVar161 + auVar87._16_4_;
            auVar178._20_4_ = fVar161 + auVar87._20_4_;
            auVar178._24_4_ = fVar161 + auVar87._24_4_;
            auVar178._28_4_ = fVar161 + auVar87._28_4_;
            uVar12 = vcmpps_avx512vl(auVar178,auVar158,2);
            bVar48 = (byte)uVar13 & bVar48 & (byte)uVar12;
            auVar179._8_4_ = 2;
            auVar179._0_8_ = 0x200000002;
            auVar179._12_4_ = 2;
            auVar179._16_4_ = 2;
            auVar179._20_4_ = 2;
            auVar179._24_4_ = 2;
            auVar179._28_4_ = 2;
            auVar28._8_4_ = 3;
            auVar28._0_8_ = 0x300000003;
            auVar28._12_4_ = 3;
            auVar28._16_4_ = 3;
            auVar28._20_4_ = 3;
            auVar28._24_4_ = 3;
            auVar28._28_4_ = 3;
            auVar87 = vpblendmd_avx512vl(auVar179,auVar28);
            auVar130._0_4_ = (uint)(bVar55 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
            bVar60 = (bool)(bVar55 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar60 * auVar87._4_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar55 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar60 * auVar87._8_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar55 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar60 * auVar87._12_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar55 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar60 * auVar87._16_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar55 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar60 * auVar87._20_4_ | (uint)!bVar60 * 2;
            bVar60 = (bool)(bVar55 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar60 * auVar87._24_4_ | (uint)!bVar60 * 2;
            auVar130._28_4_ = (uint)(bVar55 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
            uVar12 = vpcmpd_avx512vl(local_520,auVar130,5);
            bVar55 = (byte)uVar12 & bVar48;
            if (bVar55 != 0) {
              auVar70 = vminps_avx(local_740._0_16_,local_780._0_16_);
              auVar68 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
              auVar76 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar69 = vminps_avx(auVar70,auVar76);
              auVar70 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar76 = vmaxps_avx(auVar68,auVar70);
              auVar192._8_4_ = 0x7fffffff;
              auVar192._0_8_ = 0x7fffffff7fffffff;
              auVar192._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx(auVar69,auVar192);
              auVar70 = vandps_avx(auVar76,auVar192);
              auVar68 = vmaxps_avx(auVar68,auVar70);
              auVar70 = vmovshdup_avx(auVar68);
              auVar70 = vmaxss_avx(auVar70,auVar68);
              auVar68 = vshufpd_avx(auVar68,auVar68,1);
              auVar68 = vmaxss_avx(auVar68,auVar70);
              fVar228 = auVar68._0_4_ * 1.9073486e-06;
              local_6c0 = vshufps_avx(auVar76,auVar76,0xff);
              local_580 = fVar161 + local_3a0._0_4_;
              fStack_57c = fVar161 + local_3a0._4_4_;
              fStack_578 = fVar161 + local_3a0._8_4_;
              fStack_574 = fVar161 + local_3a0._12_4_;
              fStack_570 = fVar161 + local_3a0._16_4_;
              fStack_56c = fVar161 + local_3a0._20_4_;
              fStack_568 = fVar161 + local_3a0._24_4_;
              fStack_564 = fVar161 + local_3a0._28_4_;
              _local_820 = local_3a0;
              local_5a0 = auVar130;
              do {
                auVar159._8_4_ = 0x7f800000;
                auVar159._0_8_ = 0x7f8000007f800000;
                auVar159._12_4_ = 0x7f800000;
                auVar159._16_4_ = 0x7f800000;
                auVar159._20_4_ = 0x7f800000;
                auVar159._24_4_ = 0x7f800000;
                auVar159._28_4_ = 0x7f800000;
                auVar87 = vblendmps_avx512vl(auVar159,auVar247._0_32_);
                auVar131._0_4_ =
                     (uint)(bVar55 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
                bVar60 = (bool)(bVar55 >> 1 & 1);
                auVar131._4_4_ = (uint)bVar60 * auVar87._4_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar55 >> 2 & 1);
                auVar131._8_4_ = (uint)bVar60 * auVar87._8_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar55 >> 3 & 1);
                auVar131._12_4_ = (uint)bVar60 * auVar87._12_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar55 >> 4 & 1);
                auVar131._16_4_ = (uint)bVar60 * auVar87._16_4_ | (uint)!bVar60 * 0x7f800000;
                bVar60 = (bool)(bVar55 >> 5 & 1);
                auVar131._20_4_ = (uint)bVar60 * auVar87._20_4_ | (uint)!bVar60 * 0x7f800000;
                auVar131._24_4_ =
                     (uint)(bVar55 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar55 >> 6) * 0x7f800000;
                auVar131._28_4_ = 0x7f800000;
                auVar87 = vshufps_avx(auVar131,auVar131,0xb1);
                auVar87 = vminps_avx(auVar131,auVar87);
                auVar88 = vshufpd_avx(auVar87,auVar87,5);
                auVar87 = vminps_avx(auVar87,auVar88);
                auVar88 = vpermpd_avx2(auVar87,0x4e);
                auVar87 = vminps_avx(auVar87,auVar88);
                uVar12 = vcmpps_avx512vl(auVar131,auVar87,0);
                bVar50 = (byte)uVar12 & bVar55;
                bVar58 = bVar55;
                if (bVar50 != 0) {
                  bVar58 = bVar50;
                }
                iVar15 = 0;
                for (uVar63 = (uint)bVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                  iVar15 = iVar15 + 1;
                }
                uVar63 = *(uint *)(local_200 + (uint)(iVar15 << 2));
                uVar62 = *(uint *)(local_380 + (uint)(iVar15 << 2));
                fVar205 = auVar67._0_4_;
                if ((float)local_7c0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_7c0._0_4_);
                }
                auVar68 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar63),0x10);
                bVar60 = true;
                uVar61 = 0;
                do {
                  uVar162 = auVar68._0_4_;
                  auVar149._4_4_ = uVar162;
                  auVar149._0_4_ = uVar162;
                  auVar149._8_4_ = uVar162;
                  auVar149._12_4_ = uVar162;
                  auVar70 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_7b0);
                  auVar76 = vmovshdup_avx(auVar68);
                  fVar248 = auVar76._0_4_;
                  fVar227 = 1.0 - fVar248;
                  fVar222 = fVar248 * fVar248;
                  auVar73 = SUB6416(ZEXT464(0x40400000),0);
                  auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar266 = vfmadd213ss_fma(auVar73,auVar76,auVar72);
                  auVar69 = vfmadd213ss_fma(auVar266,ZEXT416((uint)fVar222),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar71 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar227),auVar72);
                  auVar71 = vfmadd213ss_fma(auVar71,ZEXT416((uint)(fVar227 * fVar227)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar223 = fVar227 * fVar227 * -fVar248 * 0.5;
                  fVar224 = auVar69._0_4_ * 0.5;
                  fVar225 = auVar71._0_4_ * 0.5;
                  fVar226 = fVar248 * fVar248 * -fVar227 * 0.5;
                  auVar214._0_4_ = fVar226 * (float)local_7a0._0_4_;
                  auVar214._4_4_ = fVar226 * (float)local_7a0._4_4_;
                  auVar214._8_4_ = fVar226 * fStack_798;
                  auVar214._12_4_ = fVar226 * fStack_794;
                  auVar232._4_4_ = fVar225;
                  auVar232._0_4_ = fVar225;
                  auVar232._8_4_ = fVar225;
                  auVar232._12_4_ = fVar225;
                  auVar69 = vfmadd132ps_fma(auVar232,auVar214,local_760._0_16_);
                  auVar193._4_4_ = fVar224;
                  auVar193._0_4_ = fVar224;
                  auVar193._8_4_ = fVar224;
                  auVar193._12_4_ = fVar224;
                  auVar69 = vfmadd132ps_fma(auVar193,auVar69,local_780._0_16_);
                  auVar215._4_4_ = fVar223;
                  auVar215._0_4_ = fVar223;
                  auVar215._8_4_ = fVar223;
                  auVar215._12_4_ = fVar223;
                  auVar69 = vfmadd132ps_fma(auVar215,auVar69,local_740._0_16_);
                  auVar71 = vfmadd231ss_fma(auVar72,auVar76,ZEXT416(0x41100000));
                  local_640._0_16_ = auVar71;
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,
                                            ZEXT416(0x40800000));
                  local_660._0_16_ = auVar71;
                  auVar71 = vfmadd213ss_fma(auVar73,auVar76,ZEXT416(0xbf800000));
                  local_680._0_16_ = auVar71;
                  _local_620 = auVar69;
                  auVar69 = vsubps_avx(auVar70,auVar69);
                  auVar70 = vdpps_avx(auVar69,auVar69,0x7f);
                  fVar223 = auVar70._0_4_;
                  local_720 = ZEXT1632(auVar68);
                  if (fVar223 < 0.0) {
                    local_7e0._0_4_ = fVar222;
                    local_800._0_4_ = fVar227 * -2.0;
                    auVar264._0_4_ = sqrtf(fVar223);
                    auVar264._4_60_ = extraout_var_00;
                    auVar266 = ZEXT416(auVar266._0_4_);
                    auVar68 = auVar264._0_16_;
                  }
                  else {
                    auVar68 = vsqrtss_avx(auVar70,auVar70);
                    local_800._0_4_ = fVar227 * -2.0;
                    local_7e0._0_4_ = fVar222;
                  }
                  auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar227 + fVar227))),
                                             ZEXT416((uint)fVar227),ZEXT416((uint)fVar227));
                  auVar266 = vfmadd213ss_fma(auVar266,ZEXT416((uint)(fVar248 + fVar248)),
                                             ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                            ZEXT416((uint)(fVar227 + fVar227)),auVar71);
                  auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_800._0_4_),auVar76,
                                            ZEXT416((uint)local_7e0._0_4_));
                  fVar222 = auVar73._0_4_ * 0.5;
                  fVar224 = auVar266._0_4_ * 0.5;
                  fVar225 = auVar72._0_4_ * 0.5;
                  fVar226 = auVar71._0_4_ * 0.5;
                  auVar216._0_4_ = fVar226 * (float)local_7a0._0_4_;
                  auVar216._4_4_ = fVar226 * (float)local_7a0._4_4_;
                  auVar216._8_4_ = fVar226 * fStack_798;
                  auVar216._12_4_ = fVar226 * fStack_794;
                  auVar194._4_4_ = fVar225;
                  auVar194._0_4_ = fVar225;
                  auVar194._8_4_ = fVar225;
                  auVar194._12_4_ = fVar225;
                  auVar266 = vfmadd132ps_fma(auVar194,auVar216,local_760._0_16_);
                  auVar171._4_4_ = fVar224;
                  auVar171._0_4_ = fVar224;
                  auVar171._8_4_ = fVar224;
                  auVar171._12_4_ = fVar224;
                  auVar266 = vfmadd132ps_fma(auVar171,auVar266,local_780._0_16_);
                  auVar270._4_4_ = fVar222;
                  auVar270._0_4_ = fVar222;
                  auVar270._8_4_ = fVar222;
                  auVar270._12_4_ = fVar222;
                  auVar266 = vfmadd132ps_fma(auVar270,auVar266,local_740._0_16_);
                  local_7e0._0_16_ = vdpps_avx(auVar266,auVar266,0x7f);
                  auVar44._12_4_ = 0;
                  auVar44._0_12_ = ZEXT812(0);
                  fVar222 = local_7e0._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar222));
                  fVar224 = auVar71._0_4_;
                  local_800._0_16_ = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar222));
                  auVar21._8_4_ = 0x80000000;
                  auVar21._0_8_ = 0x8000000080000000;
                  auVar21._12_4_ = 0x80000000;
                  auVar72 = vxorps_avx512vl(local_7e0._0_16_,auVar21);
                  auVar71 = vfnmadd213ss_fma(local_800._0_16_,local_7e0._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar63 = auVar68._0_4_;
                  if (fVar222 < auVar72._0_4_) {
                    fVar225 = sqrtf(fVar222);
                    auVar68 = ZEXT416(uVar63);
                  }
                  else {
                    auVar72 = vsqrtss_avx(local_7e0._0_16_,local_7e0._0_16_);
                    fVar225 = auVar72._0_4_;
                  }
                  fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
                  auVar150._0_4_ = auVar266._0_4_ * fVar222;
                  auVar150._4_4_ = auVar266._4_4_ * fVar222;
                  auVar150._8_4_ = auVar266._8_4_ * fVar222;
                  auVar150._12_4_ = auVar266._12_4_ * fVar222;
                  auVar72 = vdpps_avx(auVar69,auVar150,0x7f);
                  fVar227 = auVar68._0_4_;
                  fVar224 = auVar72._0_4_;
                  auVar151._0_4_ = fVar224 * fVar224;
                  auVar151._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                  auVar151._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                  auVar151._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                  auVar73 = vsubps_avx512vl(auVar70,auVar151);
                  fVar226 = auVar73._0_4_;
                  auVar172._4_12_ = ZEXT812(0) << 0x20;
                  auVar172._0_4_ = fVar226;
                  auVar66 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                  auVar74 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
                  if (fVar226 < 0.0) {
                    local_6b0 = fVar222;
                    fStack_6ac = fVar222;
                    fStack_6a8 = fVar222;
                    fStack_6a4 = fVar222;
                    local_6a0 = auVar66;
                    fVar226 = sqrtf(fVar226);
                    auVar74 = ZEXT416(auVar74._0_4_);
                    auVar68 = ZEXT416(uVar63);
                    auVar73 = local_6a0;
                    fVar222 = local_6b0;
                    fVar248 = fStack_6ac;
                    fVar249 = fStack_6a8;
                    fVar250 = fStack_6a4;
                  }
                  else {
                    auVar73 = vsqrtss_avx(auVar73,auVar73);
                    fVar226 = auVar73._0_4_;
                    auVar73 = auVar66;
                    fVar248 = fVar222;
                    fVar249 = fVar222;
                    fVar250 = fVar222;
                  }
                  auVar264 = ZEXT1664(auVar69);
                  auVar173._0_4_ = (float)local_680._0_4_ * (float)local_7a0._0_4_;
                  auVar173._4_4_ = (float)local_680._0_4_ * (float)local_7a0._4_4_;
                  auVar173._8_4_ = (float)local_680._0_4_ * fStack_798;
                  auVar173._12_4_ = (float)local_680._0_4_ * fStack_794;
                  auVar195._4_4_ = local_660._0_4_;
                  auVar195._0_4_ = local_660._0_4_;
                  auVar195._8_4_ = local_660._0_4_;
                  auVar195._12_4_ = local_660._0_4_;
                  auVar64 = vfmadd132ps_fma(auVar195,auVar173,local_760._0_16_);
                  auVar174._4_4_ = local_640._0_4_;
                  auVar174._0_4_ = local_640._0_4_;
                  auVar174._8_4_ = local_640._0_4_;
                  auVar174._12_4_ = local_640._0_4_;
                  auVar64 = vfmadd132ps_fma(auVar174,auVar64,local_780._0_16_);
                  auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar76._0_4_;
                  auVar196._4_4_ = uVar162;
                  auVar196._0_4_ = uVar162;
                  auVar196._8_4_ = uVar162;
                  auVar196._12_4_ = uVar162;
                  auVar76 = vfmadd132ps_fma(auVar196,auVar64,local_740._0_16_);
                  auVar175._0_4_ = auVar76._0_4_ * (float)local_7e0._0_4_;
                  auVar175._4_4_ = auVar76._4_4_ * (float)local_7e0._0_4_;
                  auVar175._8_4_ = auVar76._8_4_ * (float)local_7e0._0_4_;
                  auVar175._12_4_ = auVar76._12_4_ * (float)local_7e0._0_4_;
                  auVar76 = vdpps_avx(auVar266,auVar76,0x7f);
                  fVar180 = auVar76._0_4_;
                  auVar197._0_4_ = auVar266._0_4_ * fVar180;
                  auVar197._4_4_ = auVar266._4_4_ * fVar180;
                  auVar197._8_4_ = auVar266._8_4_ * fVar180;
                  auVar197._12_4_ = auVar266._12_4_ * fVar180;
                  auVar76 = vsubps_avx(auVar175,auVar197);
                  fVar180 = auVar71._0_4_ * (float)local_800._0_4_;
                  auVar64 = vmaxss_avx(ZEXT416((uint)fVar228),
                                       ZEXT416((uint)(local_720._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar75 = vxorps_avx512vl(auVar266,auVar22);
                  auVar198._0_4_ = fVar222 * auVar76._0_4_ * fVar180;
                  auVar198._4_4_ = fVar248 * auVar76._4_4_ * fVar180;
                  auVar198._8_4_ = fVar249 * auVar76._8_4_ * fVar180;
                  auVar198._12_4_ = fVar250 * auVar76._12_4_ * fVar180;
                  auVar267 = ZEXT1664(auVar150);
                  auVar76 = vdpps_avx(auVar75,auVar150,0x7f);
                  auVar71 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar228),auVar64);
                  auVar68 = vdpps_avx(auVar69,auVar198,0x7f);
                  auVar143 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                             ZEXT416((uint)(fVar228 / fVar225)),auVar71);
                  fVar222 = auVar76._0_4_ + auVar68._0_4_;
                  auVar68 = vdpps_avx(local_7b0,auVar150,0x7f);
                  auVar76 = vdpps_avx(auVar69,auVar75,0x7f);
                  auVar71 = vmulss_avx512f(auVar74,auVar73);
                  fVar225 = auVar66._0_4_ * 1.5 + auVar71._0_4_ * auVar73._0_4_ * auVar73._0_4_;
                  auVar71 = vdpps_avx(auVar69,local_7b0,0x7f);
                  auVar66 = vfnmadd231ss_fma(auVar76,auVar72,ZEXT416((uint)fVar222));
                  auVar71 = vfnmadd231ss_fma(auVar71,auVar72,auVar68);
                  auVar76 = vpermilps_avx(_local_620,0xff);
                  fVar226 = fVar226 - auVar76._0_4_;
                  auVar73 = vshufps_avx(auVar266,auVar266,0xff);
                  auVar76 = vfmsub213ss_fma(auVar66,ZEXT416((uint)fVar225),auVar73);
                  auVar259._8_4_ = 0x80000000;
                  auVar259._0_8_ = 0x8000000080000000;
                  auVar259._12_4_ = 0x80000000;
                  auVar260 = ZEXT1664(auVar259);
                  auVar254._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar254._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar254._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar256 = ZEXT1664(auVar254);
                  auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar225));
                  auVar66 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar76._0_4_)),
                                            ZEXT416((uint)fVar222),auVar71);
                  auVar76 = vinsertps_avx(auVar254,auVar71,0x1c);
                  auVar239._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
                  auVar239._8_4_ = auVar68._8_4_ ^ 0x80000000;
                  auVar239._12_4_ = auVar68._12_4_ ^ 0x80000000;
                  auVar71 = vinsertps_avx(ZEXT416((uint)fVar222),auVar239,0x10);
                  auVar217._0_4_ = auVar66._0_4_;
                  auVar217._4_4_ = auVar217._0_4_;
                  auVar217._8_4_ = auVar217._0_4_;
                  auVar217._12_4_ = auVar217._0_4_;
                  auVar68 = vdivps_avx(auVar76,auVar217);
                  auVar76 = vdivps_avx(auVar71,auVar217);
                  auVar218._0_4_ = fVar224 * auVar68._0_4_ + fVar226 * auVar76._0_4_;
                  auVar218._4_4_ = fVar224 * auVar68._4_4_ + fVar226 * auVar76._4_4_;
                  auVar218._8_4_ = fVar224 * auVar68._8_4_ + fVar226 * auVar76._8_4_;
                  auVar218._12_4_ = fVar224 * auVar68._12_4_ + fVar226 * auVar76._12_4_;
                  auVar68 = vsubps_avx(local_720._0_16_,auVar218);
                  auVar23._8_4_ = 0x7fffffff;
                  auVar23._0_8_ = 0x7fffffff7fffffff;
                  auVar23._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(auVar72,auVar23);
                  if (auVar76._0_4_ < auVar143._0_4_) {
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar143._0_4_ + auVar64._0_4_)),
                                              local_6c0,ZEXT416(0x36000000));
                    auVar24._8_4_ = 0x7fffffff;
                    auVar24._0_8_ = 0x7fffffff7fffffff;
                    auVar24._12_4_ = 0x7fffffff;
                    auVar71 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar24);
                    if (auVar71._0_4_ < auVar76._0_4_) {
                      fVar205 = auVar68._0_4_ + (float)local_6d0._0_4_;
                      if (fVar205 < fVar160) {
                        bVar58 = 0;
                        goto LAB_01ac6894;
                      }
                      fVar222 = *(float *)(ray + k * 4 + 0x100);
                      auVar256 = ZEXT464((uint)fVar222);
                      auVar247 = ZEXT3264(_local_820);
                      if (fVar205 <= fVar222) {
                        auVar76 = vmovshdup_avx(auVar68);
                        bVar58 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01ac689d;
                        auVar219._0_12_ = ZEXT812(0);
                        auVar219._12_4_ = 0;
                        auVar133._16_16_ = auVar129._16_16_;
                        auVar133._0_16_ = auVar219;
                        auVar132._4_28_ = auVar133._4_28_;
                        auVar132._0_4_ = fVar223;
                        auVar76 = vrsqrt14ss_avx512f(auVar219,auVar132._0_16_);
                        fVar223 = auVar76._0_4_;
                        auVar70 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
                        pGVar2 = (context->scene->geometries).items[uVar59].ptr;
                        if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar58 = 0;
                          goto LAB_01ac689d;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar58 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ac689d;
                        fVar223 = fVar223 * 1.5 + auVar70._0_4_ * fVar223 * fVar223 * fVar223;
                        auVar199._0_4_ = auVar69._0_4_ * fVar223;
                        auVar199._4_4_ = auVar69._4_4_ * fVar223;
                        auVar199._8_4_ = auVar69._8_4_ * fVar223;
                        auVar199._12_4_ = auVar69._12_4_ * fVar223;
                        auVar71 = vfmadd213ps_fma(auVar73,auVar199,auVar266);
                        auVar70 = vshufps_avx(auVar199,auVar199,0xc9);
                        auVar76 = vshufps_avx(auVar266,auVar266,0xc9);
                        auVar200._0_4_ = auVar199._0_4_ * auVar76._0_4_;
                        auVar200._4_4_ = auVar199._4_4_ * auVar76._4_4_;
                        auVar200._8_4_ = auVar199._8_4_ * auVar76._8_4_;
                        auVar200._12_4_ = auVar199._12_4_ * auVar76._12_4_;
                        auVar266 = vfmsub231ps_fma(auVar200,auVar266,auVar70);
                        auVar70 = vshufps_avx(auVar266,auVar266,0xc9);
                        auVar76 = vshufps_avx(auVar71,auVar71,0xc9);
                        auVar266 = vshufps_avx(auVar266,auVar266,0xd2);
                        auVar152._0_4_ = auVar71._0_4_ * auVar266._0_4_;
                        auVar152._4_4_ = auVar71._4_4_ * auVar266._4_4_;
                        auVar152._8_4_ = auVar71._8_4_ * auVar266._8_4_;
                        auVar152._12_4_ = auVar71._12_4_ * auVar266._12_4_;
                        auVar70 = vfmsub231ps_fma(auVar152,auVar70,auVar76);
                        auVar221._8_4_ = 1;
                        auVar221._0_8_ = 0x100000001;
                        auVar221._12_4_ = 1;
                        auVar221._16_4_ = 1;
                        auVar221._20_4_ = 1;
                        auVar221._24_4_ = 1;
                        auVar221._28_4_ = 1;
                        local_460 = vpermps_avx2(auVar221,ZEXT1632(auVar68));
                        auVar87 = vpermps_avx2(auVar221,ZEXT1632(auVar70));
                        auVar235._8_4_ = 2;
                        auVar235._0_8_ = 0x200000002;
                        auVar235._12_4_ = 2;
                        auVar235._16_4_ = 2;
                        auVar235._20_4_ = 2;
                        auVar235._24_4_ = 2;
                        auVar235._28_4_ = 2;
                        local_4a0 = vpermps_avx2(auVar235,ZEXT1632(auVar70));
                        local_480 = auVar70._0_4_;
                        local_4c0[0] = (RTCHitN)auVar87[0];
                        local_4c0[1] = (RTCHitN)auVar87[1];
                        local_4c0[2] = (RTCHitN)auVar87[2];
                        local_4c0[3] = (RTCHitN)auVar87[3];
                        local_4c0[4] = (RTCHitN)auVar87[4];
                        local_4c0[5] = (RTCHitN)auVar87[5];
                        local_4c0[6] = (RTCHitN)auVar87[6];
                        local_4c0[7] = (RTCHitN)auVar87[7];
                        local_4c0[8] = (RTCHitN)auVar87[8];
                        local_4c0[9] = (RTCHitN)auVar87[9];
                        local_4c0[10] = (RTCHitN)auVar87[10];
                        local_4c0[0xb] = (RTCHitN)auVar87[0xb];
                        local_4c0[0xc] = (RTCHitN)auVar87[0xc];
                        local_4c0[0xd] = (RTCHitN)auVar87[0xd];
                        local_4c0[0xe] = (RTCHitN)auVar87[0xe];
                        local_4c0[0xf] = (RTCHitN)auVar87[0xf];
                        local_4c0[0x10] = (RTCHitN)auVar87[0x10];
                        local_4c0[0x11] = (RTCHitN)auVar87[0x11];
                        local_4c0[0x12] = (RTCHitN)auVar87[0x12];
                        local_4c0[0x13] = (RTCHitN)auVar87[0x13];
                        local_4c0[0x14] = (RTCHitN)auVar87[0x14];
                        local_4c0[0x15] = (RTCHitN)auVar87[0x15];
                        local_4c0[0x16] = (RTCHitN)auVar87[0x16];
                        local_4c0[0x17] = (RTCHitN)auVar87[0x17];
                        local_4c0[0x18] = (RTCHitN)auVar87[0x18];
                        local_4c0[0x19] = (RTCHitN)auVar87[0x19];
                        local_4c0[0x1a] = (RTCHitN)auVar87[0x1a];
                        local_4c0[0x1b] = (RTCHitN)auVar87[0x1b];
                        local_4c0[0x1c] = (RTCHitN)auVar87[0x1c];
                        local_4c0[0x1d] = (RTCHitN)auVar87[0x1d];
                        local_4c0[0x1e] = (RTCHitN)auVar87[0x1e];
                        local_4c0[0x1f] = (RTCHitN)auVar87[0x1f];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        local_440 = ZEXT432(0) << 0x20;
                        local_420 = local_4e0._0_8_;
                        uStack_418 = local_4e0._8_8_;
                        uStack_410 = local_4e0._16_8_;
                        uStack_408 = local_4e0._24_8_;
                        local_400 = local_500;
                        vpcmpeqd_avx2(local_500,local_500);
                        local_3e0 = context->user->instID[0];
                        uStack_3dc = local_3e0;
                        uStack_3d8 = local_3e0;
                        uStack_3d4 = local_3e0;
                        uStack_3d0 = local_3e0;
                        uStack_3cc = local_3e0;
                        uStack_3c8 = local_3e0;
                        uStack_3c4 = local_3e0;
                        local_3c0 = context->user->instPrimID[0];
                        uStack_3bc = local_3c0;
                        uStack_3b8 = local_3c0;
                        uStack_3b4 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3ac = local_3c0;
                        uStack_3a8 = local_3c0;
                        uStack_3a4 = local_3c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar205;
                        local_700 = local_540;
                        local_850.valid = (int *)local_700;
                        local_850.geometryUserPtr = pGVar2->userPtr;
                        local_850.context = context->user;
                        local_850.hit = local_4c0;
                        local_850.N = 8;
                        local_850.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar260 = ZEXT1664(auVar259);
                          auVar264 = ZEXT1664(auVar69);
                          auVar267 = ZEXT1664(auVar150);
                          (*pGVar2->occlusionFilterN)(&local_850);
                          auVar247 = ZEXT3264(_local_820);
                        }
                        if (local_700 != (undefined1  [32])0x0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            (*p_Var3)(&local_850);
                            auVar247 = ZEXT3264(_local_820);
                          }
                          auVar256 = ZEXT464((uint)fVar222);
                          uVar61 = vptestmd_avx512vl(local_700,local_700);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar61 & 1);
                          auVar134._0_4_ =
                               (uint)bVar4 * auVar87._0_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x100);
                          bVar4 = (bool)((byte)(uVar61 >> 1) & 1);
                          auVar134._4_4_ =
                               (uint)bVar4 * auVar87._4_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x104);
                          bVar4 = (bool)((byte)(uVar61 >> 2) & 1);
                          auVar134._8_4_ =
                               (uint)bVar4 * auVar87._8_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x108);
                          bVar4 = (bool)((byte)(uVar61 >> 3) & 1);
                          auVar134._12_4_ =
                               (uint)bVar4 * auVar87._12_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x10c);
                          bVar4 = (bool)((byte)(uVar61 >> 4) & 1);
                          auVar134._16_4_ =
                               (uint)bVar4 * auVar87._16_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x110);
                          bVar4 = (bool)((byte)(uVar61 >> 5) & 1);
                          auVar134._20_4_ =
                               (uint)bVar4 * auVar87._20_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x114);
                          bVar4 = (bool)((byte)(uVar61 >> 6) & 1);
                          auVar134._24_4_ =
                               (uint)bVar4 * auVar87._24_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x118);
                          bVar4 = SUB81(uVar61 >> 7,0);
                          auVar134._28_4_ =
                               (uint)bVar4 * auVar87._28_4_ |
                               (uint)!bVar4 * *(int *)(local_850.ray + 0x11c);
                          *(undefined1 (*) [32])(local_850.ray + 0x100) = auVar134;
                          bVar58 = 1;
                          if (local_700 != (undefined1  [32])0x0) goto LAB_01ac689d;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar222;
                      }
                      auVar256 = ZEXT464((uint)fVar222);
                      bVar58 = 0;
                      goto LAB_01ac689d;
                    }
                  }
                  bVar60 = uVar61 < 4;
                  uVar61 = uVar61 + 1;
                } while (uVar61 != 5);
                bVar60 = false;
                bVar58 = 5;
LAB_01ac6894:
                auVar247 = ZEXT3264(_local_820);
LAB_01ac689d:
                bVar57 = (bool)(bVar57 | bVar60 & bVar58);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar158._4_4_ = uVar162;
                auVar158._0_4_ = uVar162;
                auVar158._8_4_ = uVar162;
                auVar158._12_4_ = uVar162;
                auVar158._16_4_ = uVar162;
                auVar158._20_4_ = uVar162;
                auVar158._24_4_ = uVar162;
                auVar158._28_4_ = uVar162;
                auVar46._4_4_ = fStack_57c;
                auVar46._0_4_ = local_580;
                auVar46._8_4_ = fStack_578;
                auVar46._12_4_ = fStack_574;
                auVar46._16_4_ = fStack_570;
                auVar46._20_4_ = fStack_56c;
                auVar46._24_4_ = fStack_568;
                auVar46._28_4_ = fStack_564;
                uVar12 = vcmpps_avx512vl(auVar158,auVar46,0xd);
                bVar55 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar55 & (byte)uVar12;
                auVar130 = local_5a0;
              } while (bVar55 != 0);
            }
            uVar13 = vpcmpgtd_avx512vl(auVar130,local_520);
            uVar14 = vpcmpd_avx512vl(local_520,local_340,1);
            auVar203._0_4_ = fVar161 + (float)local_1c0._0_4_;
            auVar203._4_4_ = fVar161 + (float)local_1c0._4_4_;
            auVar203._8_4_ = fVar161 + fStack_1b8;
            auVar203._12_4_ = fVar161 + fStack_1b4;
            auVar203._16_4_ = fVar161 + fStack_1b0;
            auVar203._20_4_ = fVar161 + fStack_1ac;
            auVar203._24_4_ = fVar161 + fStack_1a8;
            auVar203._28_4_ = fVar161 + fStack_1a4;
            uVar12 = vcmpps_avx512vl(auVar203,auVar158,2);
            bVar52 = bVar52 & (byte)uVar14 & (byte)uVar12;
            auVar204._0_4_ = fVar161 + local_3a0._0_4_;
            auVar204._4_4_ = fVar161 + local_3a0._4_4_;
            auVar204._8_4_ = fVar161 + local_3a0._8_4_;
            auVar204._12_4_ = fVar161 + local_3a0._12_4_;
            auVar204._16_4_ = fVar161 + local_3a0._16_4_;
            auVar204._20_4_ = fVar161 + local_3a0._20_4_;
            auVar204._24_4_ = fVar161 + local_3a0._24_4_;
            auVar204._28_4_ = fVar161 + local_3a0._28_4_;
            uVar12 = vcmpps_avx512vl(auVar204,auVar158,2);
            bVar48 = bVar48 & (byte)uVar13 & (byte)uVar12 | bVar52;
            prim = local_690;
            if (bVar48 != 0) {
              uVar51 = (ulong)uVar54;
              abStack_180[uVar51 * 0x60] = bVar48;
              auVar135._0_4_ =
                   (uint)(bVar52 & 1) * local_1c0._0_4_ |
                   (uint)!(bool)(bVar52 & 1) * (int)local_3a0._0_4_;
              bVar60 = (bool)(bVar52 >> 1 & 1);
              auVar135._4_4_ = (uint)bVar60 * local_1c0._4_4_ | (uint)!bVar60 * (int)local_3a0._4_4_
              ;
              bVar60 = (bool)(bVar52 >> 2 & 1);
              auVar135._8_4_ = (uint)bVar60 * (int)fStack_1b8 | (uint)!bVar60 * (int)local_3a0._8_4_
              ;
              bVar60 = (bool)(bVar52 >> 3 & 1);
              auVar135._12_4_ =
                   (uint)bVar60 * (int)fStack_1b4 | (uint)!bVar60 * (int)local_3a0._12_4_;
              bVar60 = (bool)(bVar52 >> 4 & 1);
              auVar135._16_4_ =
                   (uint)bVar60 * (int)fStack_1b0 | (uint)!bVar60 * (int)local_3a0._16_4_;
              bVar60 = (bool)(bVar52 >> 5 & 1);
              auVar135._20_4_ =
                   (uint)bVar60 * (int)fStack_1ac | (uint)!bVar60 * (int)local_3a0._20_4_;
              auVar135._24_4_ =
                   (uint)(bVar52 >> 6) * (int)fStack_1a8 |
                   (uint)!(bool)(bVar52 >> 6) * (int)local_3a0._24_4_;
              auVar135._28_4_ = local_3a0._28_4_;
              *(undefined1 (*) [32])(auStack_160 + uVar51 * 0x60) = auVar135;
              uVar61 = vmovlps_avx(local_550);
              (&uStack_140)[uVar51 * 0xc] = uVar61;
              aiStack_138[uVar51 * 0x18] = local_adc + 1;
              uVar54 = uVar54 + 1;
            }
          }
        }
      }
    }
    do {
      uVar63 = uVar54;
      uVar62 = uVar63 - 1;
      if (uVar63 == 0) {
        if (bVar57 != false) {
          return bVar57;
        }
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar162;
        auVar25._0_4_ = uVar162;
        auVar25._8_4_ = uVar162;
        auVar25._12_4_ = uVar162;
        uVar12 = vcmpps_avx512vl(local_560,auVar25,2);
        uVar59 = (uint)local_688 & (uint)uVar12;
        local_688 = (ulong)uVar59;
        if (uVar59 == 0) {
          return false;
        }
        goto LAB_01ac43d4;
      }
      uVar61 = (ulong)uVar62;
      lVar53 = uVar61 * 0x60;
      auVar87 = *(undefined1 (*) [32])(auStack_160 + lVar53);
      auVar176._0_4_ = fVar161 + auVar87._0_4_;
      auVar176._4_4_ = fVar161 + auVar87._4_4_;
      auVar176._8_4_ = fVar161 + auVar87._8_4_;
      auVar176._12_4_ = fVar161 + auVar87._12_4_;
      auVar176._16_4_ = fVar161 + auVar87._16_4_;
      auVar176._20_4_ = fVar161 + auVar87._20_4_;
      auVar176._24_4_ = fVar161 + auVar87._24_4_;
      auVar176._28_4_ = fVar161 + auVar87._28_4_;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar162;
      auVar29._0_4_ = uVar162;
      auVar29._8_4_ = uVar162;
      auVar29._12_4_ = uVar162;
      auVar29._16_4_ = uVar162;
      auVar29._20_4_ = uVar162;
      auVar29._24_4_ = uVar162;
      auVar29._28_4_ = uVar162;
      uVar12 = vcmpps_avx512vl(auVar176,auVar29,2);
      uVar136 = (uint)uVar12 & (uint)abStack_180[lVar53];
      uVar54 = uVar62;
    } while (uVar136 == 0);
    uVar51 = (&uStack_140)[uVar61 * 0xc];
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar51;
    auVar202._8_4_ = 0x7f800000;
    auVar202._0_8_ = 0x7f8000007f800000;
    auVar202._12_4_ = 0x7f800000;
    auVar202._16_4_ = 0x7f800000;
    auVar202._20_4_ = 0x7f800000;
    auVar202._24_4_ = 0x7f800000;
    auVar202._28_4_ = 0x7f800000;
    auVar88 = vblendmps_avx512vl(auVar202,auVar87);
    bVar48 = (byte)uVar136;
    auVar126._0_4_ =
         (uint)(bVar48 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar48 & 1) * (int)auVar87._0_4_;
    bVar60 = (bool)((byte)(uVar136 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar60 * auVar88._4_4_ | (uint)!bVar60 * (int)auVar87._4_4_;
    bVar60 = (bool)((byte)(uVar136 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar60 * auVar88._8_4_ | (uint)!bVar60 * (int)auVar87._8_4_;
    bVar60 = (bool)((byte)(uVar136 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar60 * auVar88._12_4_ | (uint)!bVar60 * (int)auVar87._12_4_;
    bVar60 = (bool)((byte)(uVar136 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar60 * auVar88._16_4_ | (uint)!bVar60 * (int)auVar87._16_4_;
    bVar60 = (bool)((byte)(uVar136 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar60 * auVar88._20_4_ | (uint)!bVar60 * (int)auVar87._20_4_;
    bVar60 = (bool)((byte)(uVar136 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar60 * auVar88._24_4_ | (uint)!bVar60 * (int)auVar87._24_4_;
    auVar126._28_4_ =
         (uVar136 >> 7) * auVar88._28_4_ | (uint)!SUB41(uVar136 >> 7,0) * (int)auVar87._28_4_;
    auVar87 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar87 = vminps_avx(auVar126,auVar87);
    auVar88 = vshufpd_avx(auVar87,auVar87,5);
    auVar87 = vminps_avx(auVar87,auVar88);
    auVar88 = vpermpd_avx2(auVar87,0x4e);
    auVar87 = vminps_avx(auVar87,auVar88);
    uVar12 = vcmpps_avx512vl(auVar126,auVar87,0);
    bVar55 = (byte)uVar12 & bVar48;
    if (bVar55 != 0) {
      uVar136 = (uint)bVar55;
    }
    uVar137 = 0;
    for (; (uVar136 & 1) == 0; uVar136 = uVar136 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    local_adc = aiStack_138[uVar61 * 0x18];
    bVar48 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar48;
    abStack_180[lVar53] = bVar48;
    uVar54 = uVar63;
    if (bVar48 == 0) {
      uVar54 = uVar62;
    }
    uVar162 = (undefined4)uVar51;
    auVar155._4_4_ = uVar162;
    auVar155._0_4_ = uVar162;
    auVar155._8_4_ = uVar162;
    auVar155._12_4_ = uVar162;
    auVar155._16_4_ = uVar162;
    auVar155._20_4_ = uVar162;
    auVar155._24_4_ = uVar162;
    auVar155._28_4_ = uVar162;
    auVar68 = vmovshdup_avx(auVar165);
    auVar68 = vsubps_avx(auVar68,auVar165);
    auVar177._0_4_ = auVar68._0_4_;
    auVar177._4_4_ = auVar177._0_4_;
    auVar177._8_4_ = auVar177._0_4_;
    auVar177._12_4_ = auVar177._0_4_;
    auVar177._16_4_ = auVar177._0_4_;
    auVar177._20_4_ = auVar177._0_4_;
    auVar177._24_4_ = auVar177._0_4_;
    auVar177._28_4_ = auVar177._0_4_;
    auVar68 = vfmadd132ps_fma(auVar177,auVar155,_DAT_01faff20);
    auVar87 = ZEXT1632(auVar68);
    local_4c0[0] = (RTCHitN)auVar87[0];
    local_4c0[1] = (RTCHitN)auVar87[1];
    local_4c0[2] = (RTCHitN)auVar87[2];
    local_4c0[3] = (RTCHitN)auVar87[3];
    local_4c0[4] = (RTCHitN)auVar87[4];
    local_4c0[5] = (RTCHitN)auVar87[5];
    local_4c0[6] = (RTCHitN)auVar87[6];
    local_4c0[7] = (RTCHitN)auVar87[7];
    local_4c0[8] = (RTCHitN)auVar87[8];
    local_4c0[9] = (RTCHitN)auVar87[9];
    local_4c0[10] = (RTCHitN)auVar87[10];
    local_4c0[0xb] = (RTCHitN)auVar87[0xb];
    local_4c0[0xc] = (RTCHitN)auVar87[0xc];
    local_4c0[0xd] = (RTCHitN)auVar87[0xd];
    local_4c0[0xe] = (RTCHitN)auVar87[0xe];
    local_4c0[0xf] = (RTCHitN)auVar87[0xf];
    local_4c0[0x10] = (RTCHitN)auVar87[0x10];
    local_4c0[0x11] = (RTCHitN)auVar87[0x11];
    local_4c0[0x12] = (RTCHitN)auVar87[0x12];
    local_4c0[0x13] = (RTCHitN)auVar87[0x13];
    local_4c0[0x14] = (RTCHitN)auVar87[0x14];
    local_4c0[0x15] = (RTCHitN)auVar87[0x15];
    local_4c0[0x16] = (RTCHitN)auVar87[0x16];
    local_4c0[0x17] = (RTCHitN)auVar87[0x17];
    local_4c0[0x18] = (RTCHitN)auVar87[0x18];
    local_4c0[0x19] = (RTCHitN)auVar87[0x19];
    local_4c0[0x1a] = (RTCHitN)auVar87[0x1a];
    local_4c0[0x1b] = (RTCHitN)auVar87[0x1b];
    local_4c0[0x1c] = (RTCHitN)auVar87[0x1c];
    local_4c0[0x1d] = (RTCHitN)auVar87[0x1d];
    local_4c0[0x1e] = (RTCHitN)auVar87[0x1e];
    local_4c0[0x1f] = (RTCHitN)auVar87[0x1f];
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar137 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }